

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar44 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar45 [16];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  int iVar96;
  float fVar97;
  float fVar102;
  vint4 bi_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined4 uVar103;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  float fVar126;
  float fVar127;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  vint4 ai_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar146;
  vint4 bi;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  vfloat4 b0_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  vint4 ai_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar182;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  vfloat4 a0_3;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  vfloat4 a0_2;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar210;
  float fVar211;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  vfloat4 a0;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  vfloat4 a0_1;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  int iVar251;
  undefined1 in_ZMM30 [64];
  undefined1 auVar252 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  bool local_781;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar19;
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  
  PVar3 = prim[1];
  uVar18 = (ulong)(byte)PVar3;
  fVar97 = *(float *)(prim + uVar18 * 0x19 + 0x12);
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar31 = vsubps_avx(auVar31,*(undefined1 (*) [16])(prim + uVar18 * 0x19 + 6));
  auVar52._0_4_ = fVar97 * auVar31._0_4_;
  auVar52._4_4_ = fVar97 * auVar31._4_4_;
  auVar52._8_4_ = fVar97 * auVar31._8_4_;
  auVar52._12_4_ = fVar97 * auVar31._12_4_;
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar18 * 4 + 6)));
  auVar38._0_4_ = fVar97 * auVar32._0_4_;
  auVar38._4_4_ = fVar97 * auVar32._4_4_;
  auVar38._8_4_ = fVar97 * auVar32._8_4_;
  auVar38._12_4_ = fVar97 * auVar32._12_4_;
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar18 * 5 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar18 * 6 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar18 * 0xb + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar18 + 6)));
  uVar27 = (ulong)(uint)((int)(uVar18 * 9) * 2);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 + uVar18 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  uVar23 = (ulong)(uint)((int)(uVar18 * 5) << 2);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar55._4_4_ = auVar38._0_4_;
  auVar55._0_4_ = auVar38._0_4_;
  auVar55._8_4_ = auVar38._0_4_;
  auVar55._12_4_ = auVar38._0_4_;
  auVar36 = vshufps_avx(auVar38,auVar38,0x55);
  auVar34 = vshufps_avx(auVar38,auVar38,0xaa);
  fVar97 = auVar34._0_4_;
  auVar54._0_4_ = fVar97 * auVar28._0_4_;
  fVar102 = auVar34._4_4_;
  auVar54._4_4_ = fVar102 * auVar28._4_4_;
  fVar214 = auVar34._8_4_;
  auVar54._8_4_ = fVar214 * auVar28._8_4_;
  fVar199 = auVar34._12_4_;
  auVar54._12_4_ = fVar199 * auVar28._12_4_;
  auVar43._0_4_ = auVar29._0_4_ * fVar97;
  auVar43._4_4_ = auVar29._4_4_ * fVar102;
  auVar43._8_4_ = auVar29._8_4_ * fVar214;
  auVar43._12_4_ = auVar29._12_4_ * fVar199;
  auVar39._0_4_ = auVar30._0_4_ * fVar97;
  auVar39._4_4_ = auVar30._4_4_ * fVar102;
  auVar39._8_4_ = auVar30._8_4_ * fVar214;
  auVar39._12_4_ = auVar30._12_4_ * fVar199;
  auVar34 = vfmadd231ps_fma(auVar54,auVar36,auVar32);
  auVar35 = vfmadd231ps_fma(auVar43,auVar36,auVar42);
  auVar36 = vfmadd231ps_fma(auVar39,auVar40,auVar36);
  auVar37 = vfmadd231ps_fma(auVar34,auVar55,auVar31);
  auVar35 = vfmadd231ps_fma(auVar35,auVar55,auVar33);
  auVar38 = vfmadd231ps_fma(auVar36,auVar41,auVar55);
  auVar239._4_4_ = auVar52._0_4_;
  auVar239._0_4_ = auVar52._0_4_;
  auVar239._8_4_ = auVar52._0_4_;
  auVar239._12_4_ = auVar52._0_4_;
  auVar36 = vshufps_avx(auVar52,auVar52,0x55);
  auVar34 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar78._16_48_ = in_ZmmResult._16_48_;
  auVar28 = vmulps_avx512vl(auVar34,auVar28);
  auVar44._0_4_ = auVar34._0_4_ * auVar29._0_4_;
  auVar44._4_4_ = auVar34._4_4_ * auVar29._4_4_;
  auVar44._8_4_ = auVar34._8_4_ * auVar29._8_4_;
  auVar44._12_4_ = auVar34._12_4_ * auVar29._12_4_;
  auVar50._0_4_ = auVar34._0_4_ * auVar30._0_4_;
  auVar50._4_4_ = auVar34._4_4_ * auVar30._4_4_;
  auVar50._8_4_ = auVar34._8_4_ * auVar30._8_4_;
  auVar50._12_4_ = auVar34._12_4_ * auVar30._12_4_;
  auVar29 = vfmadd231ps_avx512vl(auVar28,auVar36,auVar32);
  auVar32 = vfmadd231ps_fma(auVar44,auVar36,auVar42);
  auVar28 = vfmadd231ps_fma(auVar50,auVar36,auVar40);
  auVar30 = vfmadd231ps_avx512vl(auVar29,auVar239,auVar31);
  auVar29 = vfmadd231ps_fma(auVar32,auVar239,auVar33);
  auVar40 = vfmadd231ps_fma(auVar28,auVar239,auVar41);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT1664(auVar31);
  auVar32 = vandps_avx512vl(auVar37,auVar31);
  auVar47._8_4_ = 0x219392ef;
  auVar47._0_8_ = 0x219392ef219392ef;
  auVar47._12_4_ = 0x219392ef;
  uVar27 = vcmpps_avx512vl(auVar32,auVar47,1);
  bVar25 = (bool)((byte)uVar27 & 1);
  auVar34._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar37._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar37._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar37._8_4_;
  bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar37._12_4_;
  auVar32 = vandps_avx512vl(auVar35,auVar31);
  uVar27 = vcmpps_avx512vl(auVar32,auVar47,1);
  bVar25 = (bool)((byte)uVar27 & 1);
  auVar37._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar35._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar35._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar35._8_4_;
  bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar37._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar35._12_4_;
  auVar31 = vandps_avx512vl(auVar38,auVar31);
  uVar27 = vcmpps_avx512vl(auVar31,auVar47,1);
  bVar25 = (bool)((byte)uVar27 & 1);
  auVar35._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar38._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar38._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar38._8_4_;
  bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar38._12_4_;
  auVar32 = vrcp14ps_avx512vl(auVar34);
  auVar48._8_4_ = 0x3f800000;
  auVar48._0_8_ = &DAT_3f8000003f800000;
  auVar48._12_4_ = 0x3f800000;
  auVar31 = vfnmadd213ps_fma(auVar34,auVar32,auVar48);
  auVar28 = vfmadd132ps_fma(auVar31,auVar32,auVar32);
  auVar32 = vrcp14ps_avx512vl(auVar37);
  auVar31 = vfnmadd213ps_fma(auVar37,auVar32,auVar48);
  auVar42 = vfmadd132ps_fma(auVar31,auVar32,auVar32);
  auVar32 = vrcp14ps_avx512vl(auVar35);
  auVar31 = vfnmadd213ps_fma(auVar35,auVar32,auVar48);
  auVar41 = vfmadd132ps_fma(auVar31,auVar32,auVar32);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar18 * 7 + 6);
  auVar31 = vpmovsxwd_avx(auVar31);
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar33 = vsubps_avx512vl(auVar31,auVar30);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar18 * 9 + 6);
  auVar31 = vpmovsxwd_avx(auVar32);
  auVar46._0_4_ = auVar28._0_4_ * auVar33._0_4_;
  auVar46._4_4_ = auVar28._4_4_ * auVar33._4_4_;
  auVar46._8_4_ = auVar28._8_4_ * auVar33._8_4_;
  auVar46._12_4_ = auVar28._12_4_ * auVar33._12_4_;
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar31 = vsubps_avx512vl(auVar31,auVar30);
  auVar51._0_4_ = auVar28._0_4_ * auVar31._0_4_;
  auVar51._4_4_ = auVar28._4_4_ * auVar31._4_4_;
  auVar51._8_4_ = auVar28._8_4_ * auVar31._8_4_;
  auVar51._12_4_ = auVar28._12_4_ * auVar31._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar32 = vpmovsxwd_avx(auVar28);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar18 * -2 + 6);
  auVar31 = vpmovsxwd_avx(auVar33);
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar31 = vsubps_avx(auVar31,auVar29);
  auVar49._0_4_ = auVar42._0_4_ * auVar31._0_4_;
  auVar49._4_4_ = auVar42._4_4_ * auVar31._4_4_;
  auVar49._8_4_ = auVar42._8_4_ * auVar31._8_4_;
  auVar49._12_4_ = auVar42._12_4_ * auVar31._12_4_;
  auVar31 = vcvtdq2ps_avx(auVar32);
  auVar31 = vsubps_avx(auVar31,auVar29);
  auVar45._0_4_ = auVar42._0_4_ * auVar31._0_4_;
  auVar45._4_4_ = auVar42._4_4_ * auVar31._4_4_;
  auVar45._8_4_ = auVar42._8_4_ * auVar31._8_4_;
  auVar45._12_4_ = auVar42._12_4_ * auVar31._12_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar23 + uVar18 + 6);
  auVar31 = vpmovsxwd_avx(auVar42);
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar31 = vsubps_avx(auVar31,auVar40);
  auVar53._0_4_ = auVar41._0_4_ * auVar31._0_4_;
  auVar53._4_4_ = auVar41._4_4_ * auVar31._4_4_;
  auVar53._8_4_ = auVar41._8_4_ * auVar31._8_4_;
  auVar53._12_4_ = auVar41._12_4_ * auVar31._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar18 * 0x17 + 6);
  auVar31 = vpmovsxwd_avx(auVar29);
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar31 = vsubps_avx(auVar31,auVar40);
  auVar98._0_4_ = auVar41._0_4_ * auVar31._0_4_;
  auVar98._4_4_ = auVar41._4_4_ * auVar31._4_4_;
  auVar98._8_4_ = auVar41._8_4_ * auVar31._8_4_;
  auVar98._12_4_ = auVar41._12_4_ * auVar31._12_4_;
  auVar31 = vpminsd_avx(auVar46,auVar51);
  auVar32 = vpminsd_avx(auVar49,auVar45);
  auVar31 = vmaxps_avx(auVar31,auVar32);
  auVar32 = vpminsd_avx(auVar53,auVar98);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar41._4_4_ = uVar103;
  auVar41._0_4_ = uVar103;
  auVar41._8_4_ = uVar103;
  auVar41._12_4_ = uVar103;
  auVar32 = vmaxps_avx512vl(auVar32,auVar41);
  auVar31 = vmaxps_avx(auVar31,auVar32);
  auVar40._8_4_ = 0x3f7ffffa;
  auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar40._12_4_ = 0x3f7ffffa;
  local_580 = vmulps_avx512vl(auVar31,auVar40);
  auVar31 = vpmaxsd_avx(auVar46,auVar51);
  auVar32 = vpmaxsd_avx(auVar49,auVar45);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar32 = vpmaxsd_avx(auVar53,auVar98);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar30._4_4_ = uVar103;
  auVar30._0_4_ = uVar103;
  auVar30._8_4_ = uVar103;
  auVar30._12_4_ = uVar103;
  auVar32 = vminps_avx512vl(auVar32,auVar30);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar36._8_4_ = 0x3f800003;
  auVar36._0_8_ = 0x3f8000033f800003;
  auVar36._12_4_ = 0x3f800003;
  auVar31 = vmulps_avx512vl(auVar31,auVar36);
  auVar32 = vpbroadcastd_avx512vl();
  uVar9 = vcmpps_avx512vl(local_580,auVar31,2);
  uVar27 = vpcmpgtd_avx512vl(auVar32,_DAT_01ff0cf0);
  uVar27 = ((byte)uVar9 & 0xf) & uVar27;
  bVar25 = (char)uVar27 == '\0';
  local_781 = !bVar25;
  if (bVar25) {
    return local_781;
  }
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar250 = ZEXT1664(auVar31);
  auVar101 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar101);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar101 = ZEXT1664(auVar31);
  auVar78._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar252 = ZEXT1664(auVar78._0_16_);
LAB_01b7cf98:
  lVar21 = 0;
  for (uVar18 = uVar27; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
    lVar21 = lVar21 + 1;
  }
  uVar24 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar24].ptr;
  uVar18 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar21 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar31 = *(undefined1 (*) [16])(_Var8 + uVar18 * (long)pvVar7);
  auVar32 = *(undefined1 (*) [16])(_Var8 + (uVar18 + 1) * (long)pvVar7);
  auVar28 = *(undefined1 (*) [16])(_Var8 + (uVar18 + 2) * (long)pvVar7);
  auVar33 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar18 + 3));
  lVar21 = *(long *)&pGVar5[1].time_range.upper;
  auVar42 = *(undefined1 (*) [16])(lVar21 + (long)p_Var6 * uVar18);
  auVar29 = *(undefined1 (*) [16])(lVar21 + (long)p_Var6 * (uVar18 + 1));
  auVar41 = *(undefined1 (*) [16])(lVar21 + (long)p_Var6 * (uVar18 + 2));
  uVar27 = uVar27 - 1 & uVar27;
  auVar40 = *(undefined1 (*) [16])(lVar21 + (long)p_Var6 * (uVar18 + 3));
  if (uVar27 != 0) {
    uVar23 = uVar27 - 1 & uVar27;
    for (uVar18 = uVar27; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
    }
    if (uVar23 != 0) {
      for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar235._16_48_ = auVar78._16_48_;
  auVar43 = auVar250._0_16_;
  auVar34 = vmulps_avx512vl(auVar40,auVar43);
  auVar36 = vfmadd213ps_fma((undefined1  [16])0x0,auVar41,auVar34);
  auVar104._0_4_ = auVar29._0_4_ + auVar36._0_4_;
  auVar104._4_4_ = auVar29._4_4_ + auVar36._4_4_;
  auVar104._8_4_ = auVar29._8_4_ + auVar36._8_4_;
  auVar104._12_4_ = auVar29._12_4_ + auVar36._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar104,auVar42,auVar43);
  auVar235._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar36 = vmulps_avx512vl(auVar40,auVar235._0_16_);
  auVar98 = auVar101._0_16_;
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar41,auVar98);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar29,auVar235._0_16_);
  auVar37 = vfnmadd231ps_avx512vl(auVar36,auVar42,auVar98);
  auVar38 = vmulps_avx512vl(auVar33,auVar43);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar28,auVar38);
  auVar240._0_4_ = auVar36._0_4_ + auVar32._0_4_;
  auVar240._4_4_ = auVar36._4_4_ + auVar32._4_4_;
  auVar240._8_4_ = auVar36._8_4_ + auVar32._8_4_;
  auVar240._12_4_ = auVar36._12_4_ + auVar32._12_4_;
  auVar36 = vfmadd231ps_avx512vl(auVar240,auVar31,auVar43);
  auVar39 = vmulps_avx512vl(auVar33,auVar235._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar28,auVar98);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar32,auVar235._0_16_);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar31,auVar98);
  auVar128._0_4_ = auVar41._0_4_ + auVar34._0_4_;
  auVar128._4_4_ = auVar41._4_4_ + auVar34._4_4_;
  auVar128._8_4_ = auVar41._8_4_ + auVar34._8_4_;
  auVar128._12_4_ = auVar41._12_4_ + auVar34._12_4_;
  auVar34 = vfmadd231ps_avx512vl(auVar128,auVar29,auVar235._0_16_);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar42,auVar43);
  auVar40 = vmulps_avx512vl(auVar40,auVar98);
  auVar41 = vfmadd231ps_avx512vl(auVar40,auVar235._0_16_,auVar41);
  auVar29 = vfnmadd231ps_avx512vl(auVar41,auVar98,auVar29);
  auVar41 = vfmadd231ps_avx512vl(auVar29,auVar235._0_16_,auVar42);
  auVar192._0_4_ = auVar38._0_4_ + auVar28._0_4_;
  auVar192._4_4_ = auVar38._4_4_ + auVar28._4_4_;
  auVar192._8_4_ = auVar38._8_4_ + auVar28._8_4_;
  auVar192._12_4_ = auVar38._12_4_ + auVar28._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar192,auVar32,auVar235._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar31,auVar43);
  auVar33 = vmulps_avx512vl(auVar33,auVar98);
  auVar28 = vfmadd231ps_avx512vl(auVar33,auVar235._0_16_,auVar28);
  auVar32 = vfnmadd231ps_avx512vl(auVar28,auVar98,auVar32);
  auVar29 = vfmadd231ps_avx512vl(auVar32,auVar235._0_16_,auVar31);
  auVar31 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar32 = vshufps_avx(auVar36,auVar36,0xc9);
  fVar210 = auVar37._0_4_;
  auVar155._0_4_ = fVar210 * auVar32._0_4_;
  fVar211 = auVar37._4_4_;
  auVar155._4_4_ = fVar211 * auVar32._4_4_;
  fVar126 = auVar37._8_4_;
  auVar155._8_4_ = fVar126 * auVar32._8_4_;
  fVar127 = auVar37._12_4_;
  auVar155._12_4_ = fVar127 * auVar32._12_4_;
  auVar32 = vfmsub231ps_fma(auVar155,auVar31,auVar36);
  auVar28 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar32 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar156._0_4_ = fVar210 * auVar32._0_4_;
  auVar156._4_4_ = fVar211 * auVar32._4_4_;
  auVar156._8_4_ = fVar126 * auVar32._8_4_;
  auVar156._12_4_ = fVar127 * auVar32._12_4_;
  auVar31 = vfmsub231ps_fma(auVar156,auVar31,auVar39);
  auVar33 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar32 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar140 = auVar41._0_4_;
  auVar147._0_4_ = fVar140 * auVar32._0_4_;
  fVar146 = auVar41._4_4_;
  auVar147._4_4_ = fVar146 * auVar32._4_4_;
  fVar212 = auVar41._8_4_;
  auVar147._8_4_ = fVar212 * auVar32._8_4_;
  fVar213 = auVar41._12_4_;
  auVar147._12_4_ = fVar213 * auVar32._12_4_;
  auVar32 = vfmsub231ps_fma(auVar147,auVar31,auVar42);
  auVar42 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar32 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar193._0_4_ = auVar32._0_4_ * fVar140;
  auVar193._4_4_ = auVar32._4_4_ * fVar146;
  auVar193._8_4_ = auVar32._8_4_ * fVar212;
  auVar193._12_4_ = auVar32._12_4_ * fVar213;
  auVar31 = vfmsub231ps_fma(auVar193,auVar31,auVar29);
  auVar29 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vdpps_avx(auVar28,auVar28,0x7f);
  fVar102 = auVar31._0_4_;
  auVar101._4_60_ = auVar235._4_60_;
  auVar101._0_4_ = fVar102;
  auVar32 = vrsqrt14ss_avx512f(auVar235._0_16_,auVar101._0_16_);
  fVar97 = auVar32._0_4_;
  auVar32 = vmulss_avx512f(auVar31,ZEXT416(0xbf000000));
  fVar97 = fVar97 * 1.5 + auVar32._0_4_ * fVar97 * fVar97 * fVar97;
  fVar226 = fVar97 * auVar28._0_4_;
  fVar236 = fVar97 * auVar28._4_4_;
  fVar237 = fVar97 * auVar28._8_4_;
  fVar238 = fVar97 * auVar28._12_4_;
  auVar32 = vdpps_avx(auVar28,auVar33,0x7f);
  auVar200._0_4_ = auVar33._0_4_ * fVar102;
  auVar200._4_4_ = auVar33._4_4_ * fVar102;
  auVar200._8_4_ = auVar33._8_4_ * fVar102;
  auVar200._12_4_ = auVar33._12_4_ * fVar102;
  fVar102 = auVar32._0_4_;
  auVar164._0_4_ = fVar102 * auVar28._0_4_;
  auVar164._4_4_ = fVar102 * auVar28._4_4_;
  auVar164._8_4_ = fVar102 * auVar28._8_4_;
  auVar164._12_4_ = fVar102 * auVar28._12_4_;
  auVar28 = vsubps_avx(auVar200,auVar164);
  auVar32 = vrcp14ss_avx512f(auVar235._0_16_,auVar101._0_16_);
  auVar31 = vfnmadd213ss_avx512f(auVar31,auVar32,ZEXT416(0x40000000));
  fVar214 = auVar32._0_4_ * auVar31._0_4_;
  auVar31 = vdpps_avx(auVar42,auVar42,0x7f);
  fVar199 = auVar31._0_4_;
  auVar248._16_48_ = auVar235._16_48_;
  auVar248._0_16_ = auVar235._0_16_;
  auVar77._4_60_ = auVar248._4_60_;
  auVar77._0_4_ = fVar199;
  auVar32 = vrsqrt14ss_avx512f(auVar235._0_16_,auVar77._0_16_);
  fVar102 = auVar32._0_4_;
  auVar32 = vmulss_avx512f(auVar31,ZEXT416(0xbf000000));
  fVar102 = fVar102 * 1.5 + auVar32._0_4_ * fVar102 * fVar102 * fVar102;
  fVar215 = fVar102 * auVar42._0_4_;
  fVar223 = fVar102 * auVar42._4_4_;
  fVar224 = fVar102 * auVar42._8_4_;
  fVar225 = fVar102 * auVar42._12_4_;
  auVar32 = vdpps_avx(auVar42,auVar29,0x7f);
  auVar157._0_4_ = fVar199 * auVar29._0_4_;
  auVar157._4_4_ = fVar199 * auVar29._4_4_;
  auVar157._8_4_ = fVar199 * auVar29._8_4_;
  auVar157._12_4_ = fVar199 * auVar29._12_4_;
  fVar199 = auVar32._0_4_;
  auVar148._0_4_ = fVar199 * auVar42._0_4_;
  auVar148._4_4_ = fVar199 * auVar42._4_4_;
  auVar148._8_4_ = fVar199 * auVar42._8_4_;
  auVar148._12_4_ = fVar199 * auVar42._12_4_;
  auVar33 = vsubps_avx(auVar157,auVar148);
  auVar32 = vrcp14ss_avx512f(auVar235._0_16_,auVar77._0_16_);
  auVar31 = vfnmadd213ss_avx512f(auVar31,auVar32,ZEXT416(0x40000000));
  fVar199 = auVar31._0_4_ * auVar32._0_4_;
  auVar31 = vshufps_avx(auVar35,auVar35,0xff);
  auVar183._0_4_ = fVar226 * auVar31._0_4_;
  auVar183._4_4_ = fVar236 * auVar31._4_4_;
  auVar183._8_4_ = fVar237 * auVar31._8_4_;
  auVar183._12_4_ = fVar238 * auVar31._12_4_;
  local_500 = vsubps_avx(auVar35,auVar183);
  auVar32 = vshufps_avx(auVar37,auVar37,0xff);
  auVar158._0_4_ = auVar32._0_4_ * fVar226 + auVar31._0_4_ * fVar97 * fVar214 * auVar28._0_4_;
  auVar158._4_4_ = auVar32._4_4_ * fVar236 + auVar31._4_4_ * fVar97 * fVar214 * auVar28._4_4_;
  auVar158._8_4_ = auVar32._8_4_ * fVar237 + auVar31._8_4_ * fVar97 * fVar214 * auVar28._8_4_;
  auVar158._12_4_ = auVar32._12_4_ * fVar238 + auVar31._12_4_ * fVar97 * fVar214 * auVar28._12_4_;
  auVar28 = vsubps_avx(auVar37,auVar158);
  local_510._0_4_ = auVar183._0_4_ + auVar35._0_4_;
  local_510._4_4_ = auVar183._4_4_ + auVar35._4_4_;
  fStack_508 = auVar183._8_4_ + auVar35._8_4_;
  fStack_504 = auVar183._12_4_ + auVar35._12_4_;
  auVar31 = vshufps_avx(auVar34,auVar34,0xff);
  auVar159._0_4_ = fVar215 * auVar31._0_4_;
  auVar159._4_4_ = fVar223 * auVar31._4_4_;
  auVar159._8_4_ = fVar224 * auVar31._8_4_;
  auVar159._12_4_ = fVar225 * auVar31._12_4_;
  local_520 = vsubps_avx(auVar34,auVar159);
  auVar32 = vshufps_avx(auVar41,auVar41,0xff);
  auVar116._0_4_ = auVar32._0_4_ * fVar215 + auVar31._0_4_ * fVar102 * auVar33._0_4_ * fVar199;
  auVar116._4_4_ = auVar32._4_4_ * fVar223 + auVar31._4_4_ * fVar102 * auVar33._4_4_ * fVar199;
  auVar116._8_4_ = auVar32._8_4_ * fVar224 + auVar31._8_4_ * fVar102 * auVar33._8_4_ * fVar199;
  auVar116._12_4_ = auVar32._12_4_ * fVar225 + auVar31._12_4_ * fVar102 * auVar33._12_4_ * fVar199;
  auVar31 = vsubps_avx(auVar41,auVar116);
  _local_530 = vaddps_avx512vl(auVar34,auVar159);
  auVar129._0_4_ = auVar28._0_4_ * 0.33333334;
  auVar129._4_4_ = auVar28._4_4_ * 0.33333334;
  auVar129._8_4_ = auVar28._8_4_ * 0.33333334;
  auVar129._12_4_ = auVar28._12_4_ * 0.33333334;
  local_540 = vaddps_avx512vl(local_500,auVar129);
  auVar130._0_4_ = auVar31._0_4_ * 0.33333334;
  auVar130._4_4_ = auVar31._4_4_ * 0.33333334;
  auVar130._8_4_ = auVar31._8_4_ * 0.33333334;
  auVar130._12_4_ = auVar31._12_4_ * 0.33333334;
  local_550 = vsubps_avx512vl(local_520,auVar130);
  auVar105._0_4_ = (fVar210 + auVar158._0_4_) * 0.33333334;
  auVar105._4_4_ = (fVar211 + auVar158._4_4_) * 0.33333334;
  auVar105._8_4_ = (fVar126 + auVar158._8_4_) * 0.33333334;
  auVar105._12_4_ = (fVar127 + auVar158._12_4_) * 0.33333334;
  _local_560 = vaddps_avx512vl(_local_510,auVar105);
  auVar106._0_4_ = (fVar140 + auVar116._0_4_) * 0.33333334;
  auVar106._4_4_ = (fVar146 + auVar116._4_4_) * 0.33333334;
  auVar106._8_4_ = (fVar212 + auVar116._8_4_) * 0.33333334;
  auVar106._12_4_ = (fVar213 + auVar116._12_4_) * 0.33333334;
  _local_570 = vsubps_avx512vl(_local_530,auVar106);
  local_480 = vsubps_avx(local_500,auVar30);
  uVar103 = local_480._0_4_;
  auVar117._4_4_ = uVar103;
  auVar117._0_4_ = uVar103;
  auVar117._8_4_ = uVar103;
  auVar117._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_480,local_480,0x55);
  auVar32 = vshufps_avx(local_480,local_480,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar97 = pre->ray_space[k].vz.field_0.m128[0];
  fVar102 = pre->ray_space[k].vz.field_0.m128[1];
  fVar214 = pre->ray_space[k].vz.field_0.m128[2];
  fVar199 = pre->ray_space[k].vz.field_0.m128[3];
  auVar107._0_4_ = fVar97 * auVar32._0_4_;
  auVar107._4_4_ = fVar102 * auVar32._4_4_;
  auVar107._8_4_ = fVar214 * auVar32._8_4_;
  auVar107._12_4_ = fVar199 * auVar32._12_4_;
  auVar31 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar2,auVar31);
  auVar36 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar117);
  local_490 = vsubps_avx512vl(local_540,auVar30);
  uVar103 = local_490._0_4_;
  auVar131._4_4_ = uVar103;
  auVar131._0_4_ = uVar103;
  auVar131._8_4_ = uVar103;
  auVar131._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_490,local_490,0x55);
  auVar32 = vshufps_avx(local_490,local_490,0xaa);
  auVar118._0_4_ = fVar97 * auVar32._0_4_;
  auVar118._4_4_ = fVar102 * auVar32._4_4_;
  auVar118._8_4_ = fVar214 * auVar32._8_4_;
  auVar118._12_4_ = fVar199 * auVar32._12_4_;
  auVar31 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar2,auVar31);
  auVar34 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar131);
  local_4a0 = vsubps_avx512vl(local_550,auVar30);
  uVar103 = local_4a0._0_4_;
  auVar165._4_4_ = uVar103;
  auVar165._0_4_ = uVar103;
  auVar165._8_4_ = uVar103;
  auVar165._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar32 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar132._0_4_ = fVar97 * auVar32._0_4_;
  auVar132._4_4_ = fVar102 * auVar32._4_4_;
  auVar132._8_4_ = fVar214 * auVar32._8_4_;
  auVar132._12_4_ = fVar199 * auVar32._12_4_;
  auVar31 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar2,auVar31);
  auVar35 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar165);
  local_4b0 = vsubps_avx(local_520,auVar30);
  uVar103 = local_4b0._0_4_;
  auVar166._4_4_ = uVar103;
  auVar166._0_4_ = uVar103;
  auVar166._8_4_ = uVar103;
  auVar166._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar32 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar194._0_4_ = auVar32._0_4_ * fVar97;
  auVar194._4_4_ = auVar32._4_4_ * fVar102;
  auVar194._8_4_ = auVar32._8_4_ * fVar214;
  auVar194._12_4_ = auVar32._12_4_ * fVar199;
  auVar31 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar2,auVar31);
  auVar37 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar166);
  local_4c0 = vsubps_avx(_local_510,auVar30);
  uVar103 = local_4c0._0_4_;
  auVar167._4_4_ = uVar103;
  auVar167._0_4_ = uVar103;
  auVar167._8_4_ = uVar103;
  auVar167._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar32 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar201._0_4_ = auVar32._0_4_ * fVar97;
  auVar201._4_4_ = auVar32._4_4_ * fVar102;
  auVar201._8_4_ = auVar32._8_4_ * fVar214;
  auVar201._12_4_ = auVar32._12_4_ * fVar199;
  auVar31 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar2,auVar31);
  auVar38 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar167);
  local_4d0 = vsubps_avx512vl(_local_560,auVar30);
  uVar103 = local_4d0._0_4_;
  auVar168._4_4_ = uVar103;
  auVar168._0_4_ = uVar103;
  auVar168._8_4_ = uVar103;
  auVar168._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar32 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar216._0_4_ = auVar32._0_4_ * fVar97;
  auVar216._4_4_ = auVar32._4_4_ * fVar102;
  auVar216._8_4_ = auVar32._8_4_ * fVar214;
  auVar216._12_4_ = auVar32._12_4_ * fVar199;
  auVar31 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar2,auVar31);
  auVar39 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar168);
  local_4e0 = vsubps_avx512vl(_local_570,auVar30);
  uVar103 = local_4e0._0_4_;
  auVar169._4_4_ = uVar103;
  auVar169._0_4_ = uVar103;
  auVar169._8_4_ = uVar103;
  auVar169._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar32 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar227._0_4_ = auVar32._0_4_ * fVar97;
  auVar227._4_4_ = auVar32._4_4_ * fVar102;
  auVar227._8_4_ = auVar32._8_4_ * fVar214;
  auVar227._12_4_ = auVar32._12_4_ * fVar199;
  auVar31 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar2,auVar31);
  auVar98 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar169);
  local_4f0 = vsubps_avx512vl(_local_530,auVar30);
  uVar103 = local_4f0._0_4_;
  auVar99._4_4_ = uVar103;
  auVar99._0_4_ = uVar103;
  auVar99._8_4_ = uVar103;
  auVar99._12_4_ = uVar103;
  auVar31 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar32 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar160._0_4_ = auVar32._0_4_ * fVar97;
  auVar160._4_4_ = auVar32._4_4_ * fVar102;
  auVar160._8_4_ = auVar32._8_4_ * fVar214;
  auVar160._12_4_ = auVar32._12_4_ * fVar199;
  auVar31 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar2,auVar31);
  auVar30 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar1,auVar99);
  auVar28 = vmovlhps_avx(auVar36,auVar38);
  auVar29 = vmovlhps_avx512f(auVar34,auVar39);
  auVar41 = vmovlhps_avx512f(auVar35,auVar98);
  auVar40 = vmovlhps_avx512f(auVar37,auVar30);
  auVar31 = vminps_avx512vl(auVar28,auVar29);
  auVar33 = vmaxps_avx512vl(auVar28,auVar29);
  auVar32 = vminps_avx512vl(auVar41,auVar40);
  auVar32 = vminps_avx(auVar31,auVar32);
  auVar31 = vmaxps_avx512vl(auVar41,auVar40);
  auVar31 = vmaxps_avx(auVar33,auVar31);
  auVar33 = vshufpd_avx(auVar32,auVar32,3);
  auVar42 = vshufpd_avx(auVar31,auVar31,3);
  auVar32 = vminps_avx(auVar32,auVar33);
  auVar31 = vmaxps_avx(auVar31,auVar42);
  auVar32 = vandps_avx512vl(auVar32,auVar249._0_16_);
  auVar31 = vandps_avx512vl(auVar31,auVar249._0_16_);
  auVar31 = vmaxps_avx(auVar32,auVar31);
  auVar32 = vmovshdup_avx(auVar31);
  auVar31 = vmaxss_avx(auVar32,auVar31);
  fVar102 = auVar31._0_4_ * 9.536743e-07;
  auVar170._8_8_ = auVar36._0_8_;
  auVar170._0_8_ = auVar36._0_8_;
  auVar32 = vmovddup_avx512vl(auVar34);
  auVar33 = vmovddup_avx512vl(auVar35);
  auVar108._8_8_ = auVar37._0_8_;
  auVar108._0_8_ = auVar37._0_8_;
  local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar102));
  auVar31 = vxorps_avx512vl(local_3c0._0_16_,auVar43);
  local_3e0 = vbroadcastss_avx512vl(auVar31);
  auVar78 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar78);
  bVar25 = false;
  uVar18 = 0;
  fVar97 = *(float *)(ray + k * 4 + 0xc0);
  auVar42 = vsubps_avx512vl(auVar29,auVar28);
  auVar80._0_16_ = vsubps_avx512vl(auVar41,auVar29);
  local_470 = vsubps_avx512vl(auVar40,auVar41);
  local_590 = vsubps_avx(_local_510,local_500);
  local_5a0 = vsubps_avx512vl(_local_560,local_540);
  local_5b0 = vsubps_avx512vl(_local_570,local_550);
  _local_5c0 = vsubps_avx512vl(_local_530,local_520);
  auVar78 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar78);
  auVar31 = ZEXT816(0x3f80000000000000);
  auVar235 = ZEXT1664(auVar31);
  auVar81._32_32_ = auVar78._32_32_;
  do {
    auVar52 = auVar235._0_16_;
    auVar36 = vshufps_avx(auVar52,auVar52,0x50);
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = &DAT_3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar76._16_4_ = 0x3f800000;
    auVar76._0_16_ = auVar241;
    auVar76._20_4_ = 0x3f800000;
    auVar76._24_4_ = 0x3f800000;
    auVar76._28_4_ = 0x3f800000;
    auVar34 = vsubps_avx(auVar241,auVar36);
    fVar214 = auVar36._0_4_;
    fVar126 = auVar38._0_4_;
    auVar133._0_4_ = fVar126 * fVar214;
    fVar199 = auVar36._4_4_;
    fVar127 = auVar38._4_4_;
    auVar133._4_4_ = fVar127 * fVar199;
    fVar210 = auVar36._8_4_;
    auVar133._8_4_ = fVar126 * fVar210;
    fVar211 = auVar36._12_4_;
    auVar133._12_4_ = fVar127 * fVar211;
    fVar140 = auVar39._0_4_;
    auVar141._0_4_ = fVar140 * fVar214;
    fVar146 = auVar39._4_4_;
    auVar141._4_4_ = fVar146 * fVar199;
    auVar141._8_4_ = fVar140 * fVar210;
    auVar141._12_4_ = fVar146 * fVar211;
    fVar223 = auVar98._0_4_;
    auVar149._0_4_ = fVar223 * fVar214;
    fVar224 = auVar98._4_4_;
    auVar149._4_4_ = fVar224 * fVar199;
    auVar149._8_4_ = fVar223 * fVar210;
    auVar149._12_4_ = fVar224 * fVar211;
    fVar225 = auVar30._0_4_;
    auVar109._0_4_ = fVar225 * fVar214;
    fVar226 = auVar30._4_4_;
    auVar109._4_4_ = fVar226 * fVar199;
    auVar109._8_4_ = fVar225 * fVar210;
    auVar109._12_4_ = fVar226 * fVar211;
    auVar35 = vfmadd231ps_fma(auVar133,auVar34,auVar170);
    auVar37 = vfmadd231ps_avx512vl(auVar141,auVar34,auVar32);
    auVar43 = vfmadd231ps_avx512vl(auVar149,auVar34,auVar33);
    auVar34 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar34);
    auVar36 = vmovshdup_avx(auVar31);
    fVar199 = auVar31._0_4_;
    fVar214 = (auVar36._0_4_ - fVar199) * 0.04761905;
    auVar69._4_4_ = fVar199;
    auVar69._0_4_ = fVar199;
    auVar69._8_4_ = fVar199;
    auVar69._12_4_ = fVar199;
    auVar69._16_4_ = fVar199;
    auVar69._20_4_ = fVar199;
    auVar69._24_4_ = fVar199;
    auVar69._28_4_ = fVar199;
    auVar72._0_8_ = auVar36._0_8_;
    auVar72._8_8_ = auVar72._0_8_;
    auVar72._16_8_ = auVar72._0_8_;
    auVar72._24_8_ = auVar72._0_8_;
    auVar73 = vsubps_avx(auVar72,auVar69);
    uVar103 = auVar35._0_4_;
    auVar74._4_4_ = uVar103;
    auVar74._0_4_ = uVar103;
    auVar74._8_4_ = uVar103;
    auVar74._12_4_ = uVar103;
    auVar74._16_4_ = uVar103;
    auVar74._20_4_ = uVar103;
    auVar74._24_4_ = uVar103;
    auVar74._28_4_ = uVar103;
    auVar62._8_4_ = 1;
    auVar62._0_8_ = 0x100000001;
    auVar62._12_4_ = 1;
    auVar62._16_4_ = 1;
    auVar62._20_4_ = 1;
    auVar62._24_4_ = 1;
    auVar62._28_4_ = 1;
    auVar71 = ZEXT1632(auVar35);
    auVar70 = vpermps_avx2(auVar62,auVar71);
    auVar56 = vbroadcastss_avx512vl(auVar37);
    auVar72 = ZEXT1632(auVar37);
    auVar57 = vpermps_avx512vl(auVar62,auVar72);
    auVar58 = vbroadcastss_avx512vl(auVar43);
    auVar66 = ZEXT1632(auVar43);
    auVar59 = vpermps_avx512vl(auVar62,auVar66);
    auVar60 = vbroadcastss_avx512vl(auVar34);
    auVar68 = ZEXT1632(auVar34);
    auVar61 = vpermps_avx512vl(auVar62,auVar68);
    auVar75._4_4_ = fVar214;
    auVar75._0_4_ = fVar214;
    auVar75._8_4_ = fVar214;
    auVar75._12_4_ = fVar214;
    auVar75._16_4_ = fVar214;
    auVar75._20_4_ = fVar214;
    auVar75._24_4_ = fVar214;
    auVar75._28_4_ = fVar214;
    auVar67._8_4_ = 2;
    auVar67._0_8_ = 0x200000002;
    auVar67._12_4_ = 2;
    auVar67._16_4_ = 2;
    auVar67._20_4_ = 2;
    auVar67._24_4_ = 2;
    auVar67._28_4_ = 2;
    auVar62 = vpermps_avx512vl(auVar67,auVar71);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar64 = vpermps_avx512vl(auVar63,auVar71);
    auVar71 = vpermps_avx2(auVar67,auVar72);
    auVar65 = vpermps_avx512vl(auVar63,auVar72);
    auVar72 = vpermps_avx2(auVar67,auVar66);
    auVar66 = vpermps_avx512vl(auVar63,auVar66);
    auVar67 = vpermps_avx512vl(auVar67,auVar68);
    auVar63 = vpermps_avx512vl(auVar63,auVar68);
    auVar36 = vfmadd132ps_fma(auVar73,auVar69,_DAT_02020f20);
    auVar73 = vsubps_avx(auVar76,ZEXT1632(auVar36));
    auVar68 = vmulps_avx512vl(auVar56,ZEXT1632(auVar36));
    auVar76 = ZEXT1632(auVar36);
    auVar69 = vmulps_avx512vl(auVar57,auVar76);
    auVar34 = vfmadd231ps_fma(auVar68,auVar73,auVar74);
    auVar35 = vfmadd231ps_fma(auVar69,auVar73,auVar70);
    auVar68 = vmulps_avx512vl(auVar58,auVar76);
    auVar69 = vmulps_avx512vl(auVar59,auVar76);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar56);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar57);
    auVar56 = vmulps_avx512vl(auVar60,auVar76);
    auVar74 = ZEXT1632(auVar36);
    auVar57 = vmulps_avx512vl(auVar61,auVar74);
    auVar58 = vfmadd231ps_avx512vl(auVar56,auVar73,auVar58);
    auVar59 = vfmadd231ps_avx512vl(auVar57,auVar73,auVar59);
    fVar210 = auVar36._0_4_;
    fVar211 = auVar36._4_4_;
    auVar56._4_4_ = fVar211 * auVar68._4_4_;
    auVar56._0_4_ = fVar210 * auVar68._0_4_;
    fVar212 = auVar36._8_4_;
    auVar56._8_4_ = fVar212 * auVar68._8_4_;
    fVar213 = auVar36._12_4_;
    auVar56._12_4_ = fVar213 * auVar68._12_4_;
    auVar56._16_4_ = auVar68._16_4_ * 0.0;
    auVar56._20_4_ = auVar68._20_4_ * 0.0;
    auVar56._24_4_ = auVar68._24_4_ * 0.0;
    auVar56._28_4_ = fVar199;
    auVar57._4_4_ = fVar211 * auVar69._4_4_;
    auVar57._0_4_ = fVar210 * auVar69._0_4_;
    auVar57._8_4_ = fVar212 * auVar69._8_4_;
    auVar57._12_4_ = fVar213 * auVar69._12_4_;
    auVar57._16_4_ = auVar69._16_4_ * 0.0;
    auVar57._20_4_ = auVar69._20_4_ * 0.0;
    auVar57._24_4_ = auVar69._24_4_ * 0.0;
    auVar57._28_4_ = auVar70._28_4_;
    auVar34 = vfmadd231ps_fma(auVar56,auVar73,ZEXT1632(auVar34));
    auVar35 = vfmadd231ps_fma(auVar57,auVar73,ZEXT1632(auVar35));
    auVar61._0_4_ = fVar210 * auVar58._0_4_;
    auVar61._4_4_ = fVar211 * auVar58._4_4_;
    auVar61._8_4_ = fVar212 * auVar58._8_4_;
    auVar61._12_4_ = fVar213 * auVar58._12_4_;
    auVar61._16_4_ = auVar58._16_4_ * 0.0;
    auVar61._20_4_ = auVar58._20_4_ * 0.0;
    auVar61._24_4_ = auVar58._24_4_ * 0.0;
    auVar61._28_4_ = 0;
    auVar70._4_4_ = fVar211 * auVar59._4_4_;
    auVar70._0_4_ = fVar210 * auVar59._0_4_;
    auVar70._8_4_ = fVar212 * auVar59._8_4_;
    auVar70._12_4_ = fVar213 * auVar59._12_4_;
    auVar70._16_4_ = auVar59._16_4_ * 0.0;
    auVar70._20_4_ = auVar59._20_4_ * 0.0;
    auVar70._24_4_ = auVar59._24_4_ * 0.0;
    auVar70._28_4_ = auVar58._28_4_;
    auVar37 = vfmadd231ps_fma(auVar61,auVar73,auVar68);
    auVar43 = vfmadd231ps_fma(auVar70,auVar73,auVar69);
    auVar58._28_4_ = auVar69._28_4_;
    auVar58._0_28_ =
         ZEXT1628(CONCAT412(fVar213 * auVar43._12_4_,
                            CONCAT48(fVar212 * auVar43._8_4_,
                                     CONCAT44(fVar211 * auVar43._4_4_,fVar210 * auVar43._0_4_))));
    auVar45 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar37._12_4_,
                                                 CONCAT48(fVar212 * auVar37._8_4_,
                                                          CONCAT44(fVar211 * auVar37._4_4_,
                                                                   fVar210 * auVar37._0_4_)))),
                              auVar73,ZEXT1632(auVar34));
    auVar50 = vfmadd231ps_fma(auVar58,auVar73,ZEXT1632(auVar35));
    auVar70 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar34));
    auVar56 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar35));
    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar70 = vmulps_avx512vl(auVar70,auVar57);
    auVar56 = vmulps_avx512vl(auVar56,auVar57);
    auVar68._0_4_ = fVar214 * auVar70._0_4_;
    auVar68._4_4_ = fVar214 * auVar70._4_4_;
    auVar68._8_4_ = fVar214 * auVar70._8_4_;
    auVar68._12_4_ = fVar214 * auVar70._12_4_;
    auVar68._16_4_ = fVar214 * auVar70._16_4_;
    auVar68._20_4_ = fVar214 * auVar70._20_4_;
    auVar68._24_4_ = fVar214 * auVar70._24_4_;
    auVar68._28_4_ = 0;
    auVar70 = vmulps_avx512vl(auVar75,auVar56);
    auVar37 = vxorps_avx512vl(auVar60._0_16_,auVar60._0_16_);
    auVar56 = vpermt2ps_avx512vl(ZEXT1632(auVar45),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar58 = vpermt2ps_avx512vl(ZEXT1632(auVar50),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar115._0_4_ = auVar68._0_4_ + auVar45._0_4_;
    auVar115._4_4_ = auVar68._4_4_ + auVar45._4_4_;
    auVar115._8_4_ = auVar68._8_4_ + auVar45._8_4_;
    auVar115._12_4_ = auVar68._12_4_ + auVar45._12_4_;
    auVar115._16_4_ = auVar68._16_4_ + 0.0;
    auVar115._20_4_ = auVar68._20_4_ + 0.0;
    auVar115._24_4_ = auVar68._24_4_ + 0.0;
    auVar115._28_4_ = 0;
    auVar69 = ZEXT1632(auVar37);
    auVar59 = vpermt2ps_avx512vl(auVar68,_DAT_0205fd20,auVar69);
    auVar60 = vaddps_avx512vl(ZEXT1632(auVar50),auVar70);
    auVar61 = vpermt2ps_avx512vl(auVar70,_DAT_0205fd20,auVar69);
    auVar70 = vsubps_avx(auVar56,auVar59);
    auVar61 = vsubps_avx512vl(auVar58,auVar61);
    auVar59 = vmulps_avx512vl(auVar71,auVar74);
    auVar68 = vmulps_avx512vl(auVar65,auVar74);
    auVar59 = vfmadd231ps_avx512vl(auVar59,auVar73,auVar62);
    auVar62 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar64);
    auVar64 = vmulps_avx512vl(auVar72,auVar74);
    auVar68 = vmulps_avx512vl(auVar66,auVar74);
    auVar71 = vfmadd231ps_avx512vl(auVar64,auVar73,auVar71);
    auVar64 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar65);
    auVar65 = vmulps_avx512vl(auVar67,auVar74);
    auVar63 = vmulps_avx512vl(auVar63,auVar74);
    auVar34 = vfmadd231ps_fma(auVar65,auVar73,auVar72);
    auVar35 = vfmadd231ps_fma(auVar63,auVar73,auVar66);
    auVar63 = vmulps_avx512vl(auVar74,auVar71);
    auVar65 = vmulps_avx512vl(ZEXT1632(auVar36),auVar64);
    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar73,auVar59);
    auVar62 = vfmadd231ps_avx512vl(auVar65,auVar73,auVar62);
    auVar65 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar213 * auVar34._12_4_,
                                            CONCAT48(fVar212 * auVar34._8_4_,
                                                     CONCAT44(fVar211 * auVar34._4_4_,
                                                              fVar210 * auVar34._0_4_)))),auVar73,
                         auVar71);
    auVar64 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar213 * auVar35._12_4_,
                                            CONCAT48(fVar212 * auVar35._8_4_,
                                                     CONCAT44(fVar211 * auVar35._4_4_,
                                                              fVar210 * auVar35._0_4_)))),auVar73,
                         auVar64);
    auVar71._4_4_ = fVar211 * auVar65._4_4_;
    auVar71._0_4_ = fVar210 * auVar65._0_4_;
    auVar71._8_4_ = fVar212 * auVar65._8_4_;
    auVar71._12_4_ = fVar213 * auVar65._12_4_;
    auVar71._16_4_ = auVar65._16_4_ * 0.0;
    auVar71._20_4_ = auVar65._20_4_ * 0.0;
    auVar71._24_4_ = auVar65._24_4_ * 0.0;
    auVar71._28_4_ = auVar66._28_4_;
    auVar59._4_4_ = fVar211 * auVar64._4_4_;
    auVar59._0_4_ = fVar210 * auVar64._0_4_;
    auVar59._8_4_ = fVar212 * auVar64._8_4_;
    auVar59._12_4_ = fVar213 * auVar64._12_4_;
    auVar59._16_4_ = auVar64._16_4_ * 0.0;
    auVar59._20_4_ = auVar64._20_4_ * 0.0;
    auVar59._24_4_ = auVar64._24_4_ * 0.0;
    auVar59._28_4_ = auVar72._28_4_;
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar73,auVar63);
    auVar72 = vfmadd231ps_avx512vl(auVar59,auVar62,auVar73);
    auVar73 = vsubps_avx512vl(auVar65,auVar63);
    auVar59 = vsubps_avx512vl(auVar64,auVar62);
    auVar62 = vmulps_avx512vl(auVar73,auVar57);
    auVar57 = vmulps_avx512vl(auVar59,auVar57);
    fVar199 = fVar214 * auVar62._0_4_;
    fVar210 = fVar214 * auVar62._4_4_;
    auVar73._4_4_ = fVar210;
    auVar73._0_4_ = fVar199;
    fVar211 = fVar214 * auVar62._8_4_;
    auVar73._8_4_ = fVar211;
    fVar212 = fVar214 * auVar62._12_4_;
    auVar73._12_4_ = fVar212;
    fVar213 = fVar214 * auVar62._16_4_;
    auVar73._16_4_ = fVar213;
    fVar215 = fVar214 * auVar62._20_4_;
    auVar73._20_4_ = fVar215;
    fVar214 = fVar214 * auVar62._24_4_;
    auVar73._24_4_ = fVar214;
    auVar73._28_4_ = auVar62._28_4_;
    auVar57 = vmulps_avx512vl(auVar75,auVar57);
    auVar59 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,auVar69);
    auVar63 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,auVar69);
    auVar198._0_4_ = auVar71._0_4_ + fVar199;
    auVar198._4_4_ = auVar71._4_4_ + fVar210;
    auVar198._8_4_ = auVar71._8_4_ + fVar211;
    auVar198._12_4_ = auVar71._12_4_ + fVar212;
    auVar198._16_4_ = auVar71._16_4_ + fVar213;
    auVar198._20_4_ = auVar71._20_4_ + fVar215;
    auVar198._24_4_ = auVar71._24_4_ + fVar214;
    auVar198._28_4_ = auVar71._28_4_ + auVar62._28_4_;
    auVar73 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar62 = vaddps_avx512vl(auVar72,auVar57);
    auVar57 = vpermt2ps_avx512vl(auVar57,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar73 = vsubps_avx(auVar59,auVar73);
    auVar57 = vsubps_avx512vl(auVar63,auVar57);
    auVar139 = ZEXT1632(auVar45);
    auVar64 = vsubps_avx512vl(auVar71,auVar139);
    auVar145 = ZEXT1632(auVar50);
    auVar65 = vsubps_avx512vl(auVar72,auVar145);
    auVar66 = vsubps_avx512vl(auVar59,auVar56);
    auVar64 = vaddps_avx512vl(auVar64,auVar66);
    auVar66 = vsubps_avx512vl(auVar63,auVar58);
    auVar65 = vaddps_avx512vl(auVar65,auVar66);
    auVar66 = vmulps_avx512vl(auVar145,auVar64);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar139,auVar65);
    auVar67 = vmulps_avx512vl(auVar60,auVar64);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar115,auVar65);
    auVar68 = vmulps_avx512vl(auVar61,auVar64);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar70,auVar65);
    auVar69 = vmulps_avx512vl(auVar58,auVar64);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar56,auVar65);
    auVar74 = vmulps_avx512vl(auVar72,auVar64);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar71,auVar65);
    auVar75 = vmulps_avx512vl(auVar62,auVar64);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar198,auVar65);
    auVar76 = vmulps_avx512vl(auVar57,auVar64);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar73,auVar65);
    auVar64 = vmulps_avx512vl(auVar63,auVar64);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar59,auVar65);
    auVar65 = vminps_avx512vl(auVar66,auVar67);
    auVar66 = vmaxps_avx512vl(auVar66,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar69);
    auVar65 = vminps_avx512vl(auVar65,auVar67);
    auVar67 = vmaxps_avx512vl(auVar68,auVar69);
    auVar66 = vmaxps_avx512vl(auVar66,auVar67);
    auVar67 = vminps_avx512vl(auVar74,auVar75);
    auVar68 = vmaxps_avx512vl(auVar74,auVar75);
    auVar69 = vminps_avx512vl(auVar76,auVar64);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar65 = vminps_avx512vl(auVar65,auVar67);
    auVar64 = vmaxps_avx512vl(auVar76,auVar64);
    auVar64 = vmaxps_avx512vl(auVar68,auVar64);
    auVar64 = vmaxps_avx512vl(auVar66,auVar64);
    uVar9 = vcmpps_avx512vl(auVar65,local_3c0,2);
    uVar10 = vcmpps_avx512vl(auVar64,local_3e0,5);
    uVar22 = 0;
    bVar16 = (byte)uVar9 & (byte)uVar10 & 0x7f;
    if (bVar16 != 0) {
      auVar64 = vsubps_avx512vl(auVar56,auVar139);
      auVar65 = vsubps_avx512vl(auVar58,auVar145);
      auVar66 = vsubps_avx512vl(auVar59,auVar71);
      auVar64 = vaddps_avx512vl(auVar64,auVar66);
      auVar66 = vsubps_avx512vl(auVar63,auVar72);
      auVar65 = vaddps_avx512vl(auVar65,auVar66);
      auVar66 = vmulps_avx512vl(auVar145,auVar64);
      auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar65,auVar139);
      auVar60 = vmulps_avx512vl(auVar60,auVar64);
      auVar60 = vfnmadd213ps_avx512vl(auVar115,auVar65,auVar60);
      auVar61 = vmulps_avx512vl(auVar61,auVar64);
      auVar61 = vfnmadd213ps_avx512vl(auVar70,auVar65,auVar61);
      auVar70 = vmulps_avx512vl(auVar58,auVar64);
      auVar58 = vfnmadd231ps_avx512vl(auVar70,auVar65,auVar56);
      auVar70 = vmulps_avx512vl(auVar72,auVar64);
      auVar72 = vfnmadd231ps_avx512vl(auVar70,auVar65,auVar71);
      auVar70 = vmulps_avx512vl(auVar62,auVar64);
      auVar62 = vfnmadd213ps_avx512vl(auVar198,auVar65,auVar70);
      auVar70 = vmulps_avx512vl(auVar57,auVar64);
      auVar57 = vfnmadd213ps_avx512vl(auVar73,auVar65,auVar70);
      auVar73 = vmulps_avx512vl(auVar63,auVar64);
      auVar59 = vfnmadd231ps_avx512vl(auVar73,auVar59,auVar65);
      auVar70 = vminps_avx(auVar66,auVar60);
      auVar73 = vmaxps_avx(auVar66,auVar60);
      auVar56 = vminps_avx(auVar61,auVar58);
      auVar56 = vminps_avx(auVar70,auVar56);
      auVar70 = vmaxps_avx(auVar61,auVar58);
      auVar73 = vmaxps_avx(auVar73,auVar70);
      auVar71 = vminps_avx(auVar72,auVar62);
      auVar70 = vmaxps_avx(auVar72,auVar62);
      auVar72 = vminps_avx(auVar57,auVar59);
      auVar71 = vminps_avx(auVar71,auVar72);
      auVar71 = vminps_avx(auVar56,auVar71);
      auVar56 = vmaxps_avx(auVar57,auVar59);
      auVar70 = vmaxps_avx(auVar70,auVar56);
      auVar73 = vmaxps_avx(auVar73,auVar70);
      uVar9 = vcmpps_avx512vl(auVar73,local_3e0,5);
      uVar10 = vcmpps_avx512vl(auVar71,local_3c0,2);
      uVar22 = (uint)(bVar16 & (byte)uVar9 & (byte)uVar10);
    }
    if (uVar22 != 0) {
      auStack_600[uVar18] = uVar22;
      uVar9 = vmovlps_avx(auVar31);
      *(undefined8 *)(&uStack_460 + uVar18 * 2) = uVar9;
      uVar23 = vmovlps_avx512f(auVar52);
      auStack_3a0[uVar18] = uVar23;
      uVar18 = (ulong)((int)uVar18 + 1);
    }
    auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar101 = ZEXT1664(auVar31);
    auVar79._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar79._32_32_ = auVar81._32_32_;
    in_ZMM18 = ZEXT3264(auVar79._0_32_);
    auVar248 = ZEXT464(0x3f800000);
    auVar80._16_48_ = auVar79._16_48_;
    auVar78 = auVar80;
    do {
      auVar31 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar18 == 0) {
        if (bVar25) {
          return local_781;
        }
        uVar103 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar15._4_4_ = uVar103;
        auVar15._0_4_ = uVar103;
        auVar15._8_4_ = uVar103;
        auVar15._12_4_ = uVar103;
        uVar9 = vcmpps_avx512vl(local_580,auVar15,2);
        uVar24 = (uint)uVar27 & (uint)uVar9;
        uVar27 = (ulong)uVar24;
        local_781 = uVar24 != 0;
        if (!local_781) {
          return local_781;
        }
        goto LAB_01b7cf98;
      }
      uVar17 = (int)uVar18 - 1;
      uVar19 = (ulong)uVar17;
      uVar22 = (&uStack_460)[uVar19 * 2];
      fVar214 = afStack_45c[uVar19 * 2];
      uVar4 = auStack_600[uVar19];
      auVar228._8_8_ = 0;
      auVar228._0_8_ = auStack_3a0[uVar19];
      auVar235 = ZEXT1664(auVar228);
      lVar21 = 0;
      for (uVar23 = (ulong)uVar4; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar20 = uVar4 - 1 & uVar4;
      auStack_600[uVar19] = uVar20;
      if (uVar20 == 0) {
        uVar18 = (ulong)uVar17;
      }
      auVar119._0_4_ = (float)lVar21;
      auVar119._4_8_ = SUB128(ZEXT812(0),4);
      auVar119._12_4_ = 0;
      auVar81._32_32_ = auVar78._32_32_;
      auVar34 = vmulss_avx512f(auVar119,SUB6416(ZEXT464(0x3e124925),0));
      lVar21 = lVar21 + 1;
      auVar43 = auVar250._0_16_;
      auVar36 = vcvtsi2ss_avx512f(auVar43,lVar21);
      auVar36 = vmulss_avx512f(auVar36,SUB6416(ZEXT464(0x3e124925),0));
      auVar37 = auVar248._0_16_;
      auVar35 = vsubss_avx512f(auVar37,auVar34);
      auVar34 = vmulss_avx512f(ZEXT416((uint)fVar214),auVar34);
      auVar95._0_16_ = vfmadd231ss_avx512f(auVar34,ZEXT416(uVar22),auVar35);
      auVar34 = vsubss_avx512f(auVar37,auVar36);
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar36._0_4_)),ZEXT416(uVar22),auVar34);
      auVar34 = vsubss_avx512f(auVar36,auVar95._0_16_);
      vucomiss_avx512f(auVar34);
      if (uVar4 == 0 || lVar21 == 0) break;
      auVar35 = vshufps_avx(auVar228,auVar228,0x50);
      vucomiss_avx512f(auVar34);
      uVar22 = (uint)uVar18;
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = &DAT_3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar45 = vsubps_avx(auVar120,auVar35);
      fVar214 = auVar35._0_4_;
      auVar134._0_4_ = fVar126 * fVar214;
      fVar199 = auVar35._4_4_;
      auVar134._4_4_ = fVar127 * fVar199;
      fVar210 = auVar35._8_4_;
      auVar134._8_4_ = fVar126 * fVar210;
      fVar211 = auVar35._12_4_;
      auVar134._12_4_ = fVar127 * fVar211;
      auVar142._0_4_ = fVar140 * fVar214;
      auVar142._4_4_ = fVar146 * fVar199;
      auVar142._8_4_ = fVar140 * fVar210;
      auVar142._12_4_ = fVar146 * fVar211;
      auVar150._0_4_ = fVar223 * fVar214;
      auVar150._4_4_ = fVar224 * fVar199;
      auVar150._8_4_ = fVar223 * fVar210;
      auVar150._12_4_ = fVar224 * fVar211;
      auVar110._0_4_ = fVar225 * fVar214;
      auVar110._4_4_ = fVar226 * fVar199;
      auVar110._8_4_ = fVar225 * fVar210;
      auVar110._12_4_ = fVar226 * fVar211;
      auVar35 = vfmadd231ps_fma(auVar134,auVar45,auVar170);
      auVar50 = vfmadd231ps_fma(auVar142,auVar45,auVar32);
      auVar52 = vfmadd231ps_fma(auVar150,auVar45,auVar33);
      auVar44 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar45);
      auVar60._16_16_ = auVar35;
      auVar60._0_16_ = auVar35;
      auVar63._16_16_ = auVar50;
      auVar63._0_16_ = auVar50;
      auVar65._16_16_ = auVar52;
      auVar65._0_16_ = auVar52;
      auVar66._0_4_ = auVar95._0_4_;
      auVar66._4_4_ = auVar66._0_4_;
      auVar66._8_4_ = auVar66._0_4_;
      auVar66._12_4_ = auVar66._0_4_;
      uVar103 = auVar36._0_4_;
      auVar66._20_4_ = uVar103;
      auVar66._16_4_ = uVar103;
      auVar66._24_4_ = uVar103;
      auVar66._28_4_ = uVar103;
      auVar73 = vsubps_avx(auVar63,auVar60);
      auVar45 = vfmadd213ps_fma(auVar73,auVar66,auVar60);
      auVar73 = vsubps_avx(auVar65,auVar63);
      auVar50 = vfmadd213ps_fma(auVar73,auVar66,auVar63);
      auVar35 = vsubps_avx(auVar44,auVar52);
      auVar64._16_16_ = auVar35;
      auVar64._0_16_ = auVar35;
      auVar35 = vfmadd213ps_fma(auVar64,auVar66,auVar65);
      auVar73 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar45));
      auVar45 = vfmadd213ps_fma(auVar73,auVar66,ZEXT1632(auVar45));
      auVar73 = vsubps_avx(ZEXT1632(auVar35),ZEXT1632(auVar50));
      auVar35 = vfmadd213ps_fma(auVar73,auVar66,ZEXT1632(auVar50));
      auVar73 = vsubps_avx(ZEXT1632(auVar35),ZEXT1632(auVar45));
      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar73,auVar66);
      auVar81._0_32_ = vmulps_avx512vl(auVar73,in_ZMM18._0_32_);
      auVar83._16_48_ = auVar81._16_48_;
      auVar35 = vmulss_avx512f(auVar34,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar214 = auVar35._0_4_;
      auVar151._0_8_ =
           CONCAT44(auVar239._4_4_ + fVar214 * auVar81._4_4_,
                    auVar239._0_4_ + fVar214 * auVar81._0_4_);
      auVar151._8_4_ = auVar239._8_4_ + fVar214 * auVar81._8_4_;
      auVar151._12_4_ = auVar239._12_4_ + fVar214 * auVar81._12_4_;
      auVar135._0_4_ = fVar214 * auVar81._16_4_;
      auVar135._4_4_ = fVar214 * auVar81._20_4_;
      auVar135._8_4_ = fVar214 * auVar81._24_4_;
      auVar135._12_4_ = fVar214 * auVar81._28_4_;
      auVar49 = vsubps_avx((undefined1  [16])0x0,auVar135);
      auVar54 = vshufpd_avx(auVar239,auVar239,3);
      auVar51 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar35 = vsubps_avx(auVar54,auVar239);
      auVar45 = vsubps_avx(auVar51,(undefined1  [16])0x0);
      auVar171._0_4_ = auVar45._0_4_ + auVar35._0_4_;
      auVar171._4_4_ = auVar45._4_4_ + auVar35._4_4_;
      auVar171._8_4_ = auVar45._8_4_ + auVar35._8_4_;
      auVar171._12_4_ = auVar45._12_4_ + auVar35._12_4_;
      auVar35 = vshufps_avx(auVar239,auVar239,0xb1);
      auVar45 = vshufps_avx(auVar151,auVar151,0xb1);
      auVar50 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar52 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar229._4_4_ = auVar171._0_4_;
      auVar229._0_4_ = auVar171._0_4_;
      auVar229._8_4_ = auVar171._0_4_;
      auVar229._12_4_ = auVar171._0_4_;
      auVar44 = vshufps_avx(auVar171,auVar171,0x55);
      fVar214 = auVar44._0_4_;
      auVar184._0_4_ = auVar35._0_4_ * fVar214;
      fVar199 = auVar44._4_4_;
      auVar184._4_4_ = auVar35._4_4_ * fVar199;
      fVar210 = auVar44._8_4_;
      auVar184._8_4_ = auVar35._8_4_ * fVar210;
      fVar211 = auVar44._12_4_;
      auVar184._12_4_ = auVar35._12_4_ * fVar211;
      auVar195._0_4_ = auVar45._0_4_ * fVar214;
      auVar195._4_4_ = auVar45._4_4_ * fVar199;
      auVar195._8_4_ = auVar45._8_4_ * fVar210;
      auVar195._12_4_ = auVar45._12_4_ * fVar211;
      auVar202._0_4_ = auVar50._0_4_ * fVar214;
      auVar202._4_4_ = auVar50._4_4_ * fVar199;
      auVar202._8_4_ = auVar50._8_4_ * fVar210;
      auVar202._12_4_ = auVar50._12_4_ * fVar211;
      auVar172._0_4_ = auVar52._0_4_ * fVar214;
      auVar172._4_4_ = auVar52._4_4_ * fVar199;
      auVar172._8_4_ = auVar52._8_4_ * fVar210;
      auVar172._12_4_ = auVar52._12_4_ * fVar211;
      auVar35 = vfmadd231ps_fma(auVar184,auVar229,auVar239);
      auVar45 = vfmadd231ps_fma(auVar195,auVar229,auVar151);
      auVar44 = vfmadd231ps_fma(auVar202,auVar229,auVar49);
      auVar55 = vfmadd231ps_fma(auVar172,(undefined1  [16])0x0,auVar229);
      auVar53 = vshufpd_avx(auVar35,auVar35,1);
      auVar46 = vshufpd_avx(auVar45,auVar45,1);
      auVar47 = vshufpd_avx(auVar44,auVar44,1);
      auVar48 = vshufpd_avx(auVar55,auVar55,1);
      auVar50 = vminss_avx(auVar35,auVar45);
      auVar35 = vmaxss_avx(auVar45,auVar35);
      auVar52 = vminss_avx(auVar44,auVar55);
      auVar45 = vmaxss_avx(auVar55,auVar44);
      auVar52 = vminss_avx(auVar50,auVar52);
      auVar35 = vmaxss_avx(auVar45,auVar35);
      auVar44 = vminss_avx(auVar53,auVar46);
      auVar45 = vmaxss_avx(auVar46,auVar53);
      auVar53 = vminss_avx(auVar47,auVar48);
      auVar50 = vmaxss_avx(auVar48,auVar47);
      auVar44 = vminss_avx(auVar44,auVar53);
      auVar45 = vmaxss_avx(auVar50,auVar45);
      vucomiss_avx512f(auVar52);
      if ((uVar22 < 5) || (auVar45 = vucomiss_avx512f(auVar31), uVar22 < 5)) {
        auVar35 = vucomiss_avx512f(auVar31);
        uVar9 = vcmpps_avx512vl(auVar44,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar10 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar22 & ((byte)uVar10 | (byte)uVar9)) != 0) goto LAB_01b7dee1;
        uVar9 = vcmpps_avx512vl(auVar31,auVar45,5);
        uVar10 = vcmpps_avx512vl(auVar44,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar10 | (ushort)uVar9) & 1) == 0) goto LAB_01b7dee1;
LAB_01b7ec9f:
        bVar11 = true;
        auVar235 = ZEXT1664(auVar228);
        auVar95._16_48_ = auVar83._16_48_;
        auVar78 = auVar95;
      }
      else {
LAB_01b7dee1:
        auVar53 = auVar252._0_16_;
        uVar9 = vcmpss_avx512f(auVar52,auVar53,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        iVar96 = auVar248._0_4_;
        fVar214 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar96);
        uVar9 = vcmpss_avx512f(auVar35,auVar53,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar199 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar96);
        bVar11 = fVar214 != fVar199;
        iVar251 = auVar252._0_4_;
        auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar82._4_60_ = auVar83._4_60_;
        auVar82._0_4_ = (uint)bVar11 * iVar251 + (uint)!bVar11 * 0x7f800000;
        auVar50 = auVar82._0_16_;
        auVar85._16_48_ = auVar83._16_48_;
        auVar85._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar84._4_60_ = auVar85._4_60_;
        auVar84._0_4_ = (uint)bVar11 * iVar251 + (uint)!bVar11 * -0x800000;
        auVar31 = auVar84._0_16_;
        uVar9 = vcmpss_avx512f(auVar44,auVar53,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar210 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar96);
        if ((fVar214 != fVar210) || (NAN(fVar214) || NAN(fVar210))) {
          fVar211 = auVar44._0_4_;
          fVar214 = auVar52._0_4_;
          bVar11 = fVar211 == fVar214;
          if ((!bVar11) || (NAN(fVar211) || NAN(fVar214))) {
            auVar14._8_4_ = 0x80000000;
            auVar14._0_8_ = 0x8000000080000000;
            auVar14._12_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar52,auVar14);
            auVar244._0_4_ = auVar52._0_4_ / (fVar211 - fVar214);
            auVar244._4_12_ = auVar52._4_12_;
            auVar52 = vsubss_avx512f(auVar37,auVar244);
            auVar44 = vfmadd213ss_avx512f(auVar52,auVar53,auVar244);
            auVar52 = auVar44;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar87._16_48_ = auVar83._16_48_;
            auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar86._4_60_ = auVar87._4_60_;
            auVar86._0_4_ = (uint)bVar11 * iVar251 + (uint)!bVar11 * 0x7f800000;
            auVar44 = auVar86._0_16_;
            auVar52 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar50 = vminss_avx(auVar50,auVar44);
          auVar31 = vmaxss_avx(auVar52,auVar31);
        }
        uVar9 = vcmpss_avx512f(auVar45,auVar53,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar214 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar96);
        if ((fVar199 != fVar214) || (NAN(fVar199) || NAN(fVar214))) {
          fVar211 = auVar45._0_4_;
          fVar199 = auVar35._0_4_;
          bVar11 = fVar211 == fVar199;
          if ((!bVar11) || (NAN(fVar211) || NAN(fVar199))) {
            auVar13._8_4_ = 0x80000000;
            auVar13._0_8_ = 0x8000000080000000;
            auVar13._12_4_ = 0x80000000;
            auVar35 = vxorps_avx512vl(auVar35,auVar13);
            auVar203._0_4_ = auVar35._0_4_ / (fVar211 - fVar199);
            auVar203._4_12_ = auVar35._4_12_;
            auVar35 = vsubss_avx512f(auVar37,auVar203);
            auVar45 = vfmadd213ss_avx512f(auVar35,auVar53,auVar203);
            auVar35 = auVar45;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar89._16_48_ = auVar83._16_48_;
            auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar88._4_60_ = auVar89._4_60_;
            auVar88._0_4_ = (uint)bVar11 * iVar251 + (uint)!bVar11 * 0x7f800000;
            auVar45 = auVar88._0_16_;
            auVar35 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar50 = vminss_avx(auVar50,auVar45);
          auVar31 = vmaxss_avx(auVar35,auVar31);
        }
        bVar11 = fVar210 != fVar214;
        auVar35 = vminss_avx512f(auVar50,auVar37);
        auVar91._16_48_ = auVar83._16_48_;
        auVar91._0_16_ = auVar50;
        auVar90._4_60_ = auVar91._4_60_;
        auVar90._0_4_ = (uint)bVar11 * auVar35._0_4_ + (uint)!bVar11 * auVar50._0_4_;
        auVar35 = vmaxss_avx512f(auVar37,auVar31);
        auVar93._16_48_ = auVar83._16_48_;
        auVar93._0_16_ = auVar31;
        auVar92._4_60_ = auVar93._4_60_;
        auVar92._0_4_ = (uint)bVar11 * auVar35._0_4_ + (uint)!bVar11 * auVar31._0_4_;
        auVar31 = vmaxss_avx512f(auVar53,auVar90._0_16_);
        auVar35 = vminss_avx512f(auVar92._0_16_,auVar37);
        bVar11 = true;
        if (auVar35._0_4_ < auVar31._0_4_) goto LAB_01b7ec9f;
        auVar46 = vmaxss_avx512f(auVar53,ZEXT416((uint)(auVar31._0_4_ + -0.1)));
        auVar47 = vminss_avx512f(ZEXT416((uint)(auVar35._0_4_ + 0.1)),auVar37);
        auVar111._0_8_ = auVar239._0_8_;
        auVar111._8_8_ = auVar111._0_8_;
        auVar196._8_8_ = auVar151._0_8_;
        auVar196._0_8_ = auVar151._0_8_;
        auVar204._8_8_ = auVar49._0_8_;
        auVar204._0_8_ = auVar49._0_8_;
        auVar31 = vshufpd_avx(auVar151,auVar151,3);
        auVar35 = vshufpd_avx(auVar49,auVar49,3);
        auVar45 = vshufps_avx(auVar46,auVar47,0);
        auVar230._8_4_ = 0x3f800000;
        auVar230._0_8_ = &DAT_3f8000003f800000;
        auVar230._12_4_ = 0x3f800000;
        auVar50 = vsubps_avx(auVar230,auVar45);
        fVar214 = auVar45._0_4_;
        auVar242._0_4_ = fVar214 * auVar54._0_4_;
        fVar199 = auVar45._4_4_;
        auVar242._4_4_ = fVar199 * auVar54._4_4_;
        fVar210 = auVar45._8_4_;
        auVar242._8_4_ = fVar210 * auVar54._8_4_;
        fVar211 = auVar45._12_4_;
        auVar242._12_4_ = fVar211 * auVar54._12_4_;
        auVar152._0_4_ = fVar214 * auVar31._0_4_;
        auVar152._4_4_ = fVar199 * auVar31._4_4_;
        auVar152._8_4_ = fVar210 * auVar31._8_4_;
        auVar152._12_4_ = fVar211 * auVar31._12_4_;
        auVar161._0_4_ = fVar214 * auVar35._0_4_;
        auVar161._4_4_ = fVar199 * auVar35._4_4_;
        auVar161._8_4_ = fVar210 * auVar35._8_4_;
        auVar161._12_4_ = fVar211 * auVar35._12_4_;
        auVar136._0_4_ = fVar214 * auVar51._0_4_;
        auVar136._4_4_ = fVar199 * auVar51._4_4_;
        auVar136._8_4_ = fVar210 * auVar51._8_4_;
        auVar136._12_4_ = fVar211 * auVar51._12_4_;
        auVar52 = vfmadd231ps_fma(auVar242,auVar50,auVar111);
        auVar44 = vfmadd231ps_fma(auVar152,auVar50,auVar196);
        auVar53 = vfmadd231ps_fma(auVar161,auVar50,auVar204);
        auVar54 = vfmadd231ps_fma(auVar136,auVar50,ZEXT816(0));
        auVar31 = vsubss_avx512f(auVar37,auVar46);
        auVar35 = vmovshdup_avx512vl(auVar228);
        auVar48 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar35._0_4_ * auVar46._0_4_)),auVar228,
                                      auVar31);
        auVar31 = vsubss_avx512f(auVar37,auVar47);
        auVar49 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar47._0_4_ * auVar35._0_4_)),auVar228,
                                      auVar31);
        auVar50 = vdivss_avx512f(auVar37,auVar34);
        auVar31 = vsubps_avx(auVar44,auVar52);
        auVar121._0_4_ = auVar31._0_4_ * 3.0;
        auVar121._4_4_ = auVar31._4_4_ * 3.0;
        auVar121._8_4_ = auVar31._8_4_ * 3.0;
        auVar121._12_4_ = auVar31._12_4_ * 3.0;
        auVar31 = vsubps_avx(auVar53,auVar44);
        auVar173._0_4_ = auVar31._0_4_ * 3.0;
        auVar173._4_4_ = auVar31._4_4_ * 3.0;
        auVar173._8_4_ = auVar31._8_4_ * 3.0;
        auVar173._12_4_ = auVar31._12_4_ * 3.0;
        auVar31 = vsubps_avx(auVar54,auVar53);
        auVar185._0_4_ = auVar31._0_4_ * 3.0;
        auVar185._4_4_ = auVar31._4_4_ * 3.0;
        auVar185._8_4_ = auVar31._8_4_ * 3.0;
        auVar185._12_4_ = auVar31._12_4_ * 3.0;
        auVar34 = vminps_avx(auVar173,auVar185);
        auVar31 = vmaxps_avx(auVar173,auVar185);
        auVar34 = vminps_avx(auVar121,auVar34);
        auVar31 = vmaxps_avx(auVar121,auVar31);
        auVar35 = vshufpd_avx(auVar34,auVar34,3);
        auVar45 = vshufpd_avx(auVar31,auVar31,3);
        auVar34 = vminps_avx(auVar34,auVar35);
        auVar31 = vmaxps_avx(auVar31,auVar45);
        fVar214 = auVar50._0_4_;
        auVar186._0_4_ = fVar214 * auVar34._0_4_;
        auVar186._4_4_ = fVar214 * auVar34._4_4_;
        auVar186._8_4_ = fVar214 * auVar34._8_4_;
        auVar186._12_4_ = fVar214 * auVar34._12_4_;
        auVar174._0_4_ = fVar214 * auVar31._0_4_;
        auVar174._4_4_ = fVar214 * auVar31._4_4_;
        auVar174._8_4_ = fVar214 * auVar31._8_4_;
        auVar174._12_4_ = fVar214 * auVar31._12_4_;
        auVar51 = vdivss_avx512f(auVar37,ZEXT416((uint)(auVar49._0_4_ - auVar48._0_4_)));
        auVar31 = vshufpd_avx(auVar52,auVar52,3);
        auVar34 = vshufpd_avx(auVar44,auVar44,3);
        auVar35 = vshufpd_avx(auVar53,auVar53,3);
        auVar45 = vshufpd_avx(auVar54,auVar54,3);
        auVar31 = vsubps_avx(auVar31,auVar52);
        auVar50 = vsubps_avx(auVar34,auVar44);
        auVar52 = vsubps_avx(auVar35,auVar53);
        auVar45 = vsubps_avx(auVar45,auVar54);
        auVar34 = vminps_avx(auVar31,auVar50);
        auVar31 = vmaxps_avx(auVar31,auVar50);
        auVar35 = vminps_avx(auVar52,auVar45);
        auVar35 = vminps_avx(auVar34,auVar35);
        auVar34 = vmaxps_avx(auVar52,auVar45);
        auVar31 = vmaxps_avx(auVar31,auVar34);
        fVar214 = auVar51._0_4_;
        auVar205._0_4_ = fVar214 * auVar35._0_4_;
        auVar205._4_4_ = fVar214 * auVar35._4_4_;
        auVar205._8_4_ = fVar214 * auVar35._8_4_;
        auVar205._12_4_ = fVar214 * auVar35._12_4_;
        auVar217._0_4_ = fVar214 * auVar31._0_4_;
        auVar217._4_4_ = fVar214 * auVar31._4_4_;
        auVar217._8_4_ = fVar214 * auVar31._8_4_;
        auVar217._12_4_ = fVar214 * auVar31._12_4_;
        auVar47 = vinsertps_avx512f(auVar95._0_16_,auVar48,0x10);
        auVar45 = vinsertps_avx(auVar36,auVar49,0x10);
        auVar100._0_4_ = auVar47._0_4_ + auVar45._0_4_;
        auVar100._4_4_ = auVar47._4_4_ + auVar45._4_4_;
        auVar100._8_4_ = auVar47._8_4_ + auVar45._8_4_;
        auVar100._12_4_ = auVar47._12_4_ + auVar45._12_4_;
        auVar51 = vmulps_avx512vl(auVar100,auVar101._0_16_);
        auVar35 = vshufps_avx(auVar51,auVar51,0x54);
        uVar103 = auVar51._0_4_;
        auVar122._4_4_ = uVar103;
        auVar122._0_4_ = uVar103;
        auVar122._8_4_ = uVar103;
        auVar122._12_4_ = uVar103;
        auVar52 = vfmadd213ps_avx512vl(auVar42,auVar122,auVar28);
        auVar34 = vfmadd213ps_fma(auVar80._0_16_,auVar122,auVar29);
        auVar50 = vfmadd213ps_fma(local_470,auVar122,auVar41);
        auVar31 = vsubps_avx(auVar34,auVar52);
        auVar52 = vfmadd213ps_fma(auVar31,auVar122,auVar52);
        auVar31 = vsubps_avx(auVar50,auVar34);
        auVar31 = vfmadd213ps_fma(auVar31,auVar122,auVar34);
        auVar31 = vsubps_avx(auVar31,auVar52);
        auVar34 = vfmadd231ps_fma(auVar52,auVar31,auVar122);
        auVar123._0_8_ = CONCAT44(auVar31._4_4_ * 3.0,auVar31._0_4_ * 3.0);
        auVar123._8_4_ = auVar31._8_4_ * 3.0;
        auVar123._12_4_ = auVar31._12_4_ * 3.0;
        auVar231._8_8_ = auVar34._0_8_;
        auVar231._0_8_ = auVar34._0_8_;
        auVar31 = vshufpd_avx(auVar34,auVar34,3);
        auVar34 = vshufps_avx(auVar51,auVar51,0x55);
        auVar50 = vsubps_avx(auVar31,auVar231);
        auVar52 = vfmadd231ps_fma(auVar231,auVar34,auVar50);
        auVar245._8_8_ = auVar123._0_8_;
        auVar245._0_8_ = auVar123._0_8_;
        auVar31 = vshufpd_avx(auVar123,auVar123,3);
        auVar31 = vsubps_avx(auVar31,auVar245);
        auVar34 = vfmadd213ps_fma(auVar31,auVar34,auVar245);
        auVar44 = vxorps_avx512vl(auVar50,auVar43);
        auVar31 = vmovshdup_avx(auVar34);
        auVar43 = vxorps_avx512vl(auVar31,auVar43);
        auVar53 = vmovshdup_avx512vl(auVar50);
        auVar43 = vpermt2ps_avx512vl(auVar43,ZEXT416(5),auVar50);
        auVar31 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar31._0_4_ * auVar50._0_4_)),auVar34,auVar53
                                     );
        auVar34 = vpermt2ps_avx512vl(auVar34,SUB6416(ZEXT464(4),0),auVar44);
        auVar137._0_4_ = auVar31._0_4_;
        auVar137._4_4_ = auVar137._0_4_;
        auVar137._8_4_ = auVar137._0_4_;
        auVar137._12_4_ = auVar137._0_4_;
        auVar31 = vdivps_avx(auVar43,auVar137);
        auVar34 = vdivps_avx(auVar34,auVar137);
        fVar199 = auVar52._0_4_;
        auVar43 = vshufps_avx(auVar52,auVar52,0x55);
        fVar214 = auVar34._0_4_;
        auVar232._0_4_ = fVar199 * auVar31._0_4_ + auVar43._0_4_ * fVar214;
        auVar232._4_4_ = fVar199 * auVar31._4_4_ + auVar43._4_4_ * auVar34._4_4_;
        auVar232._8_4_ = fVar199 * auVar31._8_4_ + auVar43._8_4_ * auVar34._8_4_;
        auVar232._12_4_ = fVar199 * auVar31._12_4_ + auVar43._12_4_ * auVar34._12_4_;
        auVar46 = vsubps_avx(auVar35,auVar232);
        auVar50 = vmovshdup_avx(auVar31);
        auVar35 = vinsertps_avx(auVar186,auVar205,0x1c);
        auVar246._0_4_ = auVar50._0_4_ * auVar35._0_4_;
        auVar246._4_4_ = auVar50._4_4_ * auVar35._4_4_;
        auVar246._8_4_ = auVar50._8_4_ * auVar35._8_4_;
        auVar246._12_4_ = auVar50._12_4_ * auVar35._12_4_;
        auVar43 = vinsertps_avx(auVar174,auVar217,0x1c);
        auVar233._0_4_ = auVar50._0_4_ * auVar43._0_4_;
        auVar233._4_4_ = auVar50._4_4_ * auVar43._4_4_;
        auVar233._8_4_ = auVar50._8_4_ * auVar43._8_4_;
        auVar233._12_4_ = auVar50._12_4_ * auVar43._12_4_;
        auVar54 = vminps_avx512vl(auVar246,auVar233);
        auVar44 = vmaxps_avx(auVar233,auVar246);
        auVar53 = vmovshdup_avx(auVar34);
        auVar50 = vinsertps_avx(auVar205,auVar186,0x4c);
        auVar206._0_4_ = auVar53._0_4_ * auVar50._0_4_;
        auVar206._4_4_ = auVar53._4_4_ * auVar50._4_4_;
        auVar206._8_4_ = auVar53._8_4_ * auVar50._8_4_;
        auVar206._12_4_ = auVar53._12_4_ * auVar50._12_4_;
        auVar52 = vinsertps_avx(auVar217,auVar174,0x4c);
        auVar218._0_4_ = auVar53._0_4_ * auVar52._0_4_;
        auVar218._4_4_ = auVar53._4_4_ * auVar52._4_4_;
        auVar218._8_4_ = auVar53._8_4_ * auVar52._8_4_;
        auVar218._12_4_ = auVar53._12_4_ * auVar52._12_4_;
        auVar53 = vminps_avx(auVar206,auVar218);
        auVar54 = vaddps_avx512vl(auVar54,auVar53);
        auVar53 = vmaxps_avx(auVar218,auVar206);
        auVar207._0_4_ = auVar44._0_4_ + auVar53._0_4_;
        auVar207._4_4_ = auVar44._4_4_ + auVar53._4_4_;
        auVar207._8_4_ = auVar44._8_4_ + auVar53._8_4_;
        auVar207._12_4_ = auVar44._12_4_ + auVar53._12_4_;
        auVar219._8_8_ = 0x3f80000000000000;
        auVar219._0_8_ = 0x3f80000000000000;
        auVar44 = vsubps_avx(auVar219,auVar207);
        auVar53 = vsubps_avx(auVar219,auVar54);
        auVar54 = vsubps_avx(auVar47,auVar51);
        auVar51 = vsubps_avx(auVar45,auVar51);
        fVar213 = auVar54._0_4_;
        auVar247._0_4_ = fVar213 * auVar44._0_4_;
        fVar215 = auVar54._4_4_;
        auVar247._4_4_ = fVar215 * auVar44._4_4_;
        fVar236 = auVar54._8_4_;
        auVar247._8_4_ = fVar236 * auVar44._8_4_;
        fVar237 = auVar54._12_4_;
        auVar247._12_4_ = fVar237 * auVar44._12_4_;
        auVar55 = vbroadcastss_avx512vl(auVar31);
        auVar35 = vmulps_avx512vl(auVar55,auVar35);
        auVar43 = vmulps_avx512vl(auVar55,auVar43);
        auVar55 = vminps_avx512vl(auVar35,auVar43);
        auVar35 = vmaxps_avx(auVar43,auVar35);
        auVar187._0_4_ = fVar214 * auVar50._0_4_;
        auVar187._4_4_ = fVar214 * auVar50._4_4_;
        auVar187._8_4_ = fVar214 * auVar50._8_4_;
        auVar187._12_4_ = fVar214 * auVar50._12_4_;
        auVar175._0_4_ = fVar214 * auVar52._0_4_;
        auVar175._4_4_ = fVar214 * auVar52._4_4_;
        auVar175._8_4_ = fVar214 * auVar52._8_4_;
        auVar175._12_4_ = fVar214 * auVar52._12_4_;
        auVar43 = vminps_avx(auVar187,auVar175);
        auVar50 = vaddps_avx512vl(auVar55,auVar43);
        auVar52 = vmulps_avx512vl(auVar54,auVar53);
        fVar199 = auVar51._0_4_;
        auVar208._0_4_ = fVar199 * auVar44._0_4_;
        fVar210 = auVar51._4_4_;
        auVar208._4_4_ = fVar210 * auVar44._4_4_;
        fVar211 = auVar51._8_4_;
        auVar208._8_4_ = fVar211 * auVar44._8_4_;
        fVar212 = auVar51._12_4_;
        auVar208._12_4_ = fVar212 * auVar44._12_4_;
        auVar220._0_4_ = fVar199 * auVar53._0_4_;
        auVar220._4_4_ = fVar210 * auVar53._4_4_;
        auVar220._8_4_ = fVar211 * auVar53._8_4_;
        auVar220._12_4_ = fVar212 * auVar53._12_4_;
        auVar43 = vmaxps_avx(auVar175,auVar187);
        auVar176._0_4_ = auVar35._0_4_ + auVar43._0_4_;
        auVar176._4_4_ = auVar35._4_4_ + auVar43._4_4_;
        auVar176._8_4_ = auVar35._8_4_ + auVar43._8_4_;
        auVar176._12_4_ = auVar35._12_4_ + auVar43._12_4_;
        auVar188._8_8_ = 0x3f800000;
        auVar188._0_8_ = 0x3f800000;
        auVar35 = vsubps_avx(auVar188,auVar176);
        auVar43 = vsubps_avx(auVar188,auVar50);
        auVar243._0_4_ = fVar213 * auVar35._0_4_;
        auVar243._4_4_ = fVar215 * auVar35._4_4_;
        auVar243._8_4_ = fVar236 * auVar35._8_4_;
        auVar243._12_4_ = fVar237 * auVar35._12_4_;
        auVar234._0_4_ = fVar213 * auVar43._0_4_;
        auVar234._4_4_ = fVar215 * auVar43._4_4_;
        auVar234._8_4_ = fVar236 * auVar43._8_4_;
        auVar234._12_4_ = fVar237 * auVar43._12_4_;
        auVar177._0_4_ = fVar199 * auVar35._0_4_;
        auVar177._4_4_ = fVar210 * auVar35._4_4_;
        auVar177._8_4_ = fVar211 * auVar35._8_4_;
        auVar177._12_4_ = fVar212 * auVar35._12_4_;
        auVar189._0_4_ = fVar199 * auVar43._0_4_;
        auVar189._4_4_ = fVar210 * auVar43._4_4_;
        auVar189._8_4_ = fVar211 * auVar43._8_4_;
        auVar189._12_4_ = fVar212 * auVar43._12_4_;
        auVar35 = vminps_avx(auVar243,auVar234);
        auVar43 = vminps_avx(auVar177,auVar189);
        auVar50 = vminps_avx(auVar35,auVar43);
        auVar35 = vmaxps_avx(auVar234,auVar243);
        auVar43 = vmaxps_avx(auVar189,auVar177);
        auVar43 = vmaxps_avx(auVar43,auVar35);
        auVar44 = vminps_avx512vl(auVar247,auVar52);
        auVar35 = vminps_avx(auVar208,auVar220);
        auVar35 = vminps_avx(auVar44,auVar35);
        auVar35 = vhaddps_avx(auVar50,auVar35);
        auVar52 = vmaxps_avx512vl(auVar52,auVar247);
        auVar50 = vmaxps_avx(auVar220,auVar208);
        auVar50 = vmaxps_avx(auVar50,auVar52);
        auVar43 = vhaddps_avx(auVar43,auVar50);
        auVar35 = vshufps_avx(auVar35,auVar35,0xe8);
        auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
        auVar178._0_4_ = auVar35._0_4_ + auVar46._0_4_;
        auVar178._4_4_ = auVar35._4_4_ + auVar46._4_4_;
        auVar178._8_4_ = auVar35._8_4_ + auVar46._8_4_;
        auVar178._12_4_ = auVar35._12_4_ + auVar46._12_4_;
        auVar190._0_4_ = auVar43._0_4_ + auVar46._0_4_;
        auVar190._4_4_ = auVar43._4_4_ + auVar46._4_4_;
        auVar190._8_4_ = auVar43._8_4_ + auVar46._8_4_;
        auVar190._12_4_ = auVar43._12_4_ + auVar46._12_4_;
        auVar35 = vmaxps_avx(auVar47,auVar178);
        auVar43 = vminps_avx(auVar190,auVar45);
        uVar23 = vcmpps_avx512vl(auVar43,auVar35,1);
        auVar35 = vinsertps_avx(auVar48,auVar49,0x10);
        auVar235 = ZEXT1664(auVar35);
        auVar43 = ZEXT416(5);
        if ((uVar23 & 3) == 0) {
          vucomiss_avx512f(auVar95._0_16_);
          auVar94._0_16_ = vxorps_avx512vl(auVar43,auVar43);
          auVar94._16_48_ = auVar83._16_48_;
          auVar252 = ZEXT1664(auVar94._0_16_);
          local_640 = auVar40._0_4_;
          fStack_63c = auVar40._4_4_;
          fStack_638 = auVar40._8_4_;
          fStack_634 = auVar40._12_4_;
          if (uVar22 < 4 && (uVar4 == 0 || lVar21 == 0)) {
            bVar11 = false;
            auVar78 = auVar94;
          }
          else {
            lVar21 = 200;
            auVar78 = auVar94;
            do {
              auVar43 = vsubss_avx512f(auVar37,auVar46);
              fVar211 = auVar43._0_4_;
              fVar199 = fVar211 * fVar211 * fVar211;
              fVar212 = auVar46._0_4_;
              fVar210 = fVar212 * 3.0 * fVar211 * fVar211;
              fVar211 = fVar211 * fVar212 * fVar212 * 3.0;
              auVar153._4_4_ = fVar199;
              auVar153._0_4_ = fVar199;
              auVar153._8_4_ = fVar199;
              auVar153._12_4_ = fVar199;
              auVar143._4_4_ = fVar210;
              auVar143._0_4_ = fVar210;
              auVar143._8_4_ = fVar210;
              auVar143._12_4_ = fVar210;
              auVar112._4_4_ = fVar211;
              auVar112._0_4_ = fVar211;
              auVar112._8_4_ = fVar211;
              auVar112._12_4_ = fVar211;
              fVar212 = fVar212 * fVar212 * fVar212;
              auVar162._0_4_ = local_640 * fVar212;
              auVar162._4_4_ = fStack_63c * fVar212;
              auVar162._8_4_ = fStack_638 * fVar212;
              auVar162._12_4_ = fStack_634 * fVar212;
              auVar43 = vfmadd231ps_fma(auVar162,auVar41,auVar112);
              auVar43 = vfmadd231ps_fma(auVar43,auVar29,auVar143);
              auVar43 = vfmadd231ps_fma(auVar43,auVar28,auVar153);
              auVar113._8_8_ = auVar43._0_8_;
              auVar113._0_8_ = auVar43._0_8_;
              auVar43 = vshufpd_avx(auVar43,auVar43,3);
              auVar45 = vshufps_avx(auVar46,auVar46,0x55);
              auVar43 = vsubps_avx(auVar43,auVar113);
              auVar45 = vfmadd213ps_fma(auVar43,auVar45,auVar113);
              fVar199 = auVar45._0_4_;
              auVar43 = vshufps_avx(auVar45,auVar45,0x55);
              auVar114._0_4_ = auVar31._0_4_ * fVar199 + fVar214 * auVar43._0_4_;
              auVar114._4_4_ = auVar31._4_4_ * fVar199 + auVar34._4_4_ * auVar43._4_4_;
              auVar114._8_4_ = auVar31._8_4_ * fVar199 + auVar34._8_4_ * auVar43._8_4_;
              auVar114._12_4_ = auVar31._12_4_ * fVar199 + auVar34._12_4_ * auVar43._12_4_;
              auVar46 = vsubps_avx(auVar46,auVar114);
              auVar43 = vandps_avx512vl(auVar45,auVar249._0_16_);
              auVar78._0_16_ = vprolq_avx512vl(auVar43,0x20);
              auVar43 = vmaxss_avx(auVar78._0_16_,auVar43);
              bVar26 = auVar43._0_4_ <= fVar102;
              if (auVar43._0_4_ < fVar102) {
                auVar31 = vucomiss_avx512f(auVar94._0_16_);
                if (bVar26) {
                  auVar34 = vucomiss_avx512f(auVar31);
                  auVar248 = ZEXT1664(auVar34);
                  auVar235 = ZEXT1664(auVar35);
                  if (bVar26) {
                    vmovshdup_avx(auVar31);
                    auVar34 = vucomiss_avx512f(auVar94._0_16_);
                    if (bVar26) {
                      auVar37 = vucomiss_avx512f(auVar34);
                      auVar248 = ZEXT1664(auVar37);
                      if (bVar26) {
                        auVar43 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar51 = vinsertps_avx(auVar43,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar43 = vdpps_avx(auVar51,local_480,0x7f);
                        auVar45 = vdpps_avx(auVar51,local_490,0x7f);
                        auVar50 = vdpps_avx(auVar51,local_4a0,0x7f);
                        auVar52 = vdpps_avx(auVar51,local_4b0,0x7f);
                        auVar44 = vdpps_avx(auVar51,local_4c0,0x7f);
                        auVar53 = vdpps_avx(auVar51,local_4d0,0x7f);
                        auVar54 = vdpps_avx(auVar51,local_4e0,0x7f);
                        auVar51 = vdpps_avx(auVar51,local_4f0,0x7f);
                        auVar46 = vsubss_avx512f(auVar37,auVar34);
                        fVar214 = auVar34._0_4_;
                        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar44._0_4_)),auVar46,
                                                  auVar43);
                        auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar214)),auVar46,
                                                  auVar45);
                        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar214)),auVar46,
                                                  auVar50);
                        auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar51._0_4_)),auVar46,
                                                  auVar52);
                        auVar78._0_16_ = vsubss_avx512f(auVar37,auVar31);
                        auVar163._0_4_ = auVar78._0_4_;
                        fVar214 = auVar163._0_4_ * auVar163._0_4_ * auVar163._0_4_;
                        fVar211 = auVar31._0_4_;
                        fVar199 = fVar211 * 3.0 * auVar163._0_4_ * auVar163._0_4_;
                        fVar210 = auVar163._0_4_ * fVar211 * fVar211 * 3.0;
                        fVar213 = fVar211 * fVar211 * fVar211;
                        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar50._0_4_)),
                                                  ZEXT416((uint)fVar210),auVar45);
                        auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar199),auVar43);
                        auVar34 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar214),auVar34);
                        fVar212 = auVar34._0_4_;
                        if ((fVar97 <= fVar212) &&
                           (fVar215 = *(float *)(ray + k * 4 + 0x200), fVar212 <= fVar215)) {
                          auVar34 = vshufps_avx(auVar31,auVar31,0x55);
                          auVar191._8_4_ = 0x3f800000;
                          auVar191._0_8_ = &DAT_3f8000003f800000;
                          auVar191._12_4_ = 0x3f800000;
                          auVar37 = vsubps_avx(auVar191,auVar34);
                          fVar236 = auVar34._0_4_;
                          auVar197._0_4_ = fVar236 * (float)local_510._0_4_;
                          fVar237 = auVar34._4_4_;
                          auVar197._4_4_ = fVar237 * (float)local_510._4_4_;
                          fVar238 = auVar34._8_4_;
                          auVar197._8_4_ = fVar238 * fStack_508;
                          fVar182 = auVar34._12_4_;
                          auVar197._12_4_ = fVar182 * fStack_504;
                          auVar209._0_4_ = fVar236 * (float)local_560._0_4_;
                          auVar209._4_4_ = fVar237 * (float)local_560._4_4_;
                          auVar209._8_4_ = fVar238 * fStack_558;
                          auVar209._12_4_ = fVar182 * fStack_554;
                          auVar221._0_4_ = fVar236 * (float)local_570._0_4_;
                          auVar221._4_4_ = fVar237 * (float)local_570._4_4_;
                          auVar221._8_4_ = fVar238 * fStack_568;
                          auVar221._12_4_ = fVar182 * fStack_564;
                          auVar179._0_4_ = fVar236 * (float)local_530._0_4_;
                          auVar179._4_4_ = fVar237 * (float)local_530._4_4_;
                          auVar179._8_4_ = fVar238 * fStack_528;
                          auVar179._12_4_ = fVar182 * fStack_524;
                          auVar34 = vfmadd231ps_fma(auVar197,auVar37,local_500);
                          auVar43 = vfmadd231ps_fma(auVar209,auVar37,local_540);
                          auVar45 = vfmadd231ps_fma(auVar221,auVar37,local_550);
                          auVar50 = vfmadd231ps_fma(auVar179,auVar37,local_520);
                          auVar34 = vsubps_avx(auVar43,auVar34);
                          auVar37 = vsubps_avx(auVar45,auVar43);
                          auVar43 = vsubps_avx(auVar50,auVar45);
                          auVar222._0_4_ = fVar211 * auVar37._0_4_;
                          auVar222._4_4_ = fVar211 * auVar37._4_4_;
                          auVar222._8_4_ = fVar211 * auVar37._8_4_;
                          auVar222._12_4_ = fVar211 * auVar37._12_4_;
                          auVar163._4_4_ = auVar163._0_4_;
                          auVar163._8_4_ = auVar163._0_4_;
                          auVar163._12_4_ = auVar163._0_4_;
                          auVar34 = vfmadd231ps_fma(auVar222,auVar163,auVar34);
                          auVar180._0_4_ = fVar211 * auVar43._0_4_;
                          auVar180._4_4_ = fVar211 * auVar43._4_4_;
                          auVar180._8_4_ = fVar211 * auVar43._8_4_;
                          auVar180._12_4_ = fVar211 * auVar43._12_4_;
                          auVar37 = vfmadd231ps_fma(auVar180,auVar163,auVar37);
                          auVar181._0_4_ = fVar211 * auVar37._0_4_;
                          auVar181._4_4_ = fVar211 * auVar37._4_4_;
                          auVar181._8_4_ = fVar211 * auVar37._8_4_;
                          auVar181._12_4_ = fVar211 * auVar37._12_4_;
                          auVar34 = vfmadd231ps_fma(auVar181,auVar163,auVar34);
                          auVar12._8_4_ = 0x40400000;
                          auVar12._0_8_ = 0x4040000040400000;
                          auVar12._12_4_ = 0x40400000;
                          auVar78._0_16_ = vmulps_avx512vl(auVar34,auVar12);
                          pGVar5 = (context->scene->geometries).items[uVar24].ptr;
                          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                            bVar26 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar26 = true,
                                  pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar154._0_4_ = fVar213 * (float)local_5c0._0_4_;
                            auVar154._4_4_ = fVar213 * (float)local_5c0._4_4_;
                            auVar154._8_4_ = fVar213 * fStack_5b8;
                            auVar154._12_4_ = fVar213 * fStack_5b4;
                            auVar144._4_4_ = fVar210;
                            auVar144._0_4_ = fVar210;
                            auVar144._8_4_ = fVar210;
                            auVar144._12_4_ = fVar210;
                            auVar34 = vfmadd132ps_fma(auVar144,auVar154,local_5b0);
                            auVar138._4_4_ = fVar199;
                            auVar138._0_4_ = fVar199;
                            auVar138._8_4_ = fVar199;
                            auVar138._12_4_ = fVar199;
                            auVar34 = vfmadd132ps_fma(auVar138,auVar34,local_5a0);
                            auVar124._4_4_ = fVar214;
                            auVar124._0_4_ = fVar214;
                            auVar124._8_4_ = fVar214;
                            auVar124._12_4_ = fVar214;
                            auVar43 = vfmadd132ps_fma(auVar124,auVar34,local_590);
                            auVar34 = vshufps_avx(auVar43,auVar43,0xc9);
                            auVar37 = vshufps_avx(auVar78._0_16_,auVar78._0_16_,0xc9);
                            auVar125._0_4_ = auVar43._0_4_ * auVar37._0_4_;
                            auVar125._4_4_ = auVar43._4_4_ * auVar37._4_4_;
                            auVar125._8_4_ = auVar43._8_4_ * auVar37._8_4_;
                            auVar125._12_4_ = auVar43._12_4_ * auVar37._12_4_;
                            auVar34 = vfmsub231ps_fma(auVar125,auVar78._0_16_,auVar34);
                            local_200 = vbroadcastss_avx512f(auVar31);
                            auVar78 = vbroadcastss_avx512f(ZEXT416(1));
                            local_1c0 = vpermps_avx512f(auVar78,ZEXT1664(auVar31));
                            auVar78 = vpermps_avx512f(auVar78,ZEXT1664(auVar34));
                            auVar235 = vbroadcastss_avx512f(ZEXT416(2));
                            local_280 = vpermps_avx512f(auVar235,ZEXT1664(auVar34));
                            local_240 = vbroadcastss_avx512f(auVar34);
                            local_2c0[0] = (RTCHitN)auVar78[0];
                            local_2c0[1] = (RTCHitN)auVar78[1];
                            local_2c0[2] = (RTCHitN)auVar78[2];
                            local_2c0[3] = (RTCHitN)auVar78[3];
                            local_2c0[4] = (RTCHitN)auVar78[4];
                            local_2c0[5] = (RTCHitN)auVar78[5];
                            local_2c0[6] = (RTCHitN)auVar78[6];
                            local_2c0[7] = (RTCHitN)auVar78[7];
                            local_2c0[8] = (RTCHitN)auVar78[8];
                            local_2c0[9] = (RTCHitN)auVar78[9];
                            local_2c0[10] = (RTCHitN)auVar78[10];
                            local_2c0[0xb] = (RTCHitN)auVar78[0xb];
                            local_2c0[0xc] = (RTCHitN)auVar78[0xc];
                            local_2c0[0xd] = (RTCHitN)auVar78[0xd];
                            local_2c0[0xe] = (RTCHitN)auVar78[0xe];
                            local_2c0[0xf] = (RTCHitN)auVar78[0xf];
                            local_2c0[0x10] = (RTCHitN)auVar78[0x10];
                            local_2c0[0x11] = (RTCHitN)auVar78[0x11];
                            local_2c0[0x12] = (RTCHitN)auVar78[0x12];
                            local_2c0[0x13] = (RTCHitN)auVar78[0x13];
                            local_2c0[0x14] = (RTCHitN)auVar78[0x14];
                            local_2c0[0x15] = (RTCHitN)auVar78[0x15];
                            local_2c0[0x16] = (RTCHitN)auVar78[0x16];
                            local_2c0[0x17] = (RTCHitN)auVar78[0x17];
                            local_2c0[0x18] = (RTCHitN)auVar78[0x18];
                            local_2c0[0x19] = (RTCHitN)auVar78[0x19];
                            local_2c0[0x1a] = (RTCHitN)auVar78[0x1a];
                            local_2c0[0x1b] = (RTCHitN)auVar78[0x1b];
                            local_2c0[0x1c] = (RTCHitN)auVar78[0x1c];
                            local_2c0[0x1d] = (RTCHitN)auVar78[0x1d];
                            local_2c0[0x1e] = (RTCHitN)auVar78[0x1e];
                            local_2c0[0x1f] = (RTCHitN)auVar78[0x1f];
                            local_2c0[0x20] = (RTCHitN)auVar78[0x20];
                            local_2c0[0x21] = (RTCHitN)auVar78[0x21];
                            local_2c0[0x22] = (RTCHitN)auVar78[0x22];
                            local_2c0[0x23] = (RTCHitN)auVar78[0x23];
                            local_2c0[0x24] = (RTCHitN)auVar78[0x24];
                            local_2c0[0x25] = (RTCHitN)auVar78[0x25];
                            local_2c0[0x26] = (RTCHitN)auVar78[0x26];
                            local_2c0[0x27] = (RTCHitN)auVar78[0x27];
                            local_2c0[0x28] = (RTCHitN)auVar78[0x28];
                            local_2c0[0x29] = (RTCHitN)auVar78[0x29];
                            local_2c0[0x2a] = (RTCHitN)auVar78[0x2a];
                            local_2c0[0x2b] = (RTCHitN)auVar78[0x2b];
                            local_2c0[0x2c] = (RTCHitN)auVar78[0x2c];
                            local_2c0[0x2d] = (RTCHitN)auVar78[0x2d];
                            local_2c0[0x2e] = (RTCHitN)auVar78[0x2e];
                            local_2c0[0x2f] = (RTCHitN)auVar78[0x2f];
                            local_2c0[0x30] = (RTCHitN)auVar78[0x30];
                            local_2c0[0x31] = (RTCHitN)auVar78[0x31];
                            local_2c0[0x32] = (RTCHitN)auVar78[0x32];
                            local_2c0[0x33] = (RTCHitN)auVar78[0x33];
                            local_2c0[0x34] = (RTCHitN)auVar78[0x34];
                            local_2c0[0x35] = (RTCHitN)auVar78[0x35];
                            local_2c0[0x36] = (RTCHitN)auVar78[0x36];
                            local_2c0[0x37] = (RTCHitN)auVar78[0x37];
                            local_2c0[0x38] = (RTCHitN)auVar78[0x38];
                            local_2c0[0x39] = (RTCHitN)auVar78[0x39];
                            local_2c0[0x3a] = (RTCHitN)auVar78[0x3a];
                            local_2c0[0x3b] = (RTCHitN)auVar78[0x3b];
                            local_2c0[0x3c] = (RTCHitN)auVar78[0x3c];
                            local_2c0[0x3d] = (RTCHitN)auVar78[0x3d];
                            local_2c0[0x3e] = (RTCHitN)auVar78[0x3e];
                            local_2c0[0x3f] = (RTCHitN)auVar78[0x3f];
                            local_180 = local_300._0_8_;
                            uStack_178 = local_300._8_8_;
                            uStack_170 = local_300._16_8_;
                            uStack_168 = local_300._24_8_;
                            uStack_160 = local_300._32_8_;
                            uStack_158 = local_300._40_8_;
                            uStack_150 = local_300._48_8_;
                            uStack_148 = local_300._56_8_;
                            auVar78 = vmovdqa64_avx512f(local_340);
                            local_140 = vmovdqa64_avx512f(auVar78);
                            vpcmpeqd_avx2(auVar78._0_32_,auVar78._0_32_);
                            local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                            local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                            *(float *)(ray + k * 4 + 0x200) = fVar212;
                            local_440 = local_380;
                            local_5f0.valid = (int *)local_440;
                            local_5f0.geometryUserPtr = pGVar5->userPtr;
                            local_5f0.context = context->user;
                            local_5f0.ray = (RTCRayN *)ray;
                            local_5f0.hit = local_2c0;
                            local_5f0.N = 0x10;
                            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar5->occlusionFilterN)(&local_5f0);
                              auVar31 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
                              auVar252 = ZEXT1664(auVar31);
                              auVar248 = ZEXT464(0x3f800000);
                              auVar81._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              in_ZMM18 = ZEXT3264(auVar81._32_32_);
                              auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar101 = ZEXT1664(auVar31);
                              auVar31 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar250 = ZEXT1664(auVar31);
                              auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar249 = ZEXT1664(auVar31);
                            }
                            auVar31 = auVar252._0_16_;
                            auVar78 = vmovdqa64_avx512f(local_440);
                            uVar9 = vptestmd_avx512f(auVar78,auVar78);
                            if ((short)uVar9 == 0) {
                              bVar26 = false;
                            }
                            else {
                              p_Var6 = context->args->filter;
                              if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var6)(&local_5f0);
                                auVar31 = vxorps_avx512vl(auVar31,auVar31);
                                auVar252 = ZEXT1664(auVar31);
                                auVar248 = ZEXT464(0x3f800000);
                                auVar81._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM18 = ZEXT3264(auVar81._32_32_);
                                auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar101 = ZEXT1664(auVar31);
                                auVar31 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar250 = ZEXT1664(auVar31);
                                auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar249 = ZEXT1664(auVar31);
                              }
                              auVar78 = vmovdqa64_avx512f(local_440);
                              uVar23 = vptestmd_avx512f(auVar78,auVar78);
                              auVar235 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                              bVar26 = (bool)((byte)uVar23 & 1);
                              auVar78._0_4_ =
                                   (uint)bVar26 * auVar235._0_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x200);
                              bVar26 = (bool)((byte)(uVar23 >> 1) & 1);
                              auVar78._4_4_ =
                                   (uint)bVar26 * auVar235._4_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x204);
                              bVar26 = (bool)((byte)(uVar23 >> 2) & 1);
                              auVar78._8_4_ =
                                   (uint)bVar26 * auVar235._8_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x208);
                              bVar26 = (bool)((byte)(uVar23 >> 3) & 1);
                              auVar78._12_4_ =
                                   (uint)bVar26 * auVar235._12_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x20c);
                              bVar26 = (bool)((byte)(uVar23 >> 4) & 1);
                              auVar78._16_4_ =
                                   (uint)bVar26 * auVar235._16_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x210);
                              bVar26 = (bool)((byte)(uVar23 >> 5) & 1);
                              auVar78._20_4_ =
                                   (uint)bVar26 * auVar235._20_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x214);
                              bVar26 = (bool)((byte)(uVar23 >> 6) & 1);
                              auVar78._24_4_ =
                                   (uint)bVar26 * auVar235._24_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x218);
                              bVar26 = (bool)((byte)(uVar23 >> 7) & 1);
                              auVar78._28_4_ =
                                   (uint)bVar26 * auVar235._28_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x21c);
                              bVar26 = (bool)((byte)(uVar23 >> 8) & 1);
                              auVar78._32_4_ =
                                   (uint)bVar26 * auVar235._32_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x220);
                              bVar26 = (bool)((byte)(uVar23 >> 9) & 1);
                              auVar78._36_4_ =
                                   (uint)bVar26 * auVar235._36_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x224);
                              bVar26 = (bool)((byte)(uVar23 >> 10) & 1);
                              auVar78._40_4_ =
                                   (uint)bVar26 * auVar235._40_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x228);
                              bVar26 = (bool)((byte)(uVar23 >> 0xb) & 1);
                              auVar78._44_4_ =
                                   (uint)bVar26 * auVar235._44_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x22c);
                              bVar26 = (bool)((byte)(uVar23 >> 0xc) & 1);
                              auVar78._48_4_ =
                                   (uint)bVar26 * auVar235._48_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x230);
                              bVar26 = (bool)((byte)(uVar23 >> 0xd) & 1);
                              auVar78._52_4_ =
                                   (uint)bVar26 * auVar235._52_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x234);
                              bVar26 = (bool)((byte)(uVar23 >> 0xe) & 1);
                              auVar78._56_4_ =
                                   (uint)bVar26 * auVar235._56_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x238);
                              bVar26 = SUB81(uVar23 >> 0xf,0);
                              auVar78._60_4_ =
                                   (uint)bVar26 * auVar235._60_4_ |
                                   (uint)!bVar26 * *(int *)(local_5f0.ray + 0x23c);
                              *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar78;
                              bVar26 = (short)uVar23 != 0;
                            }
                            if (!bVar26) {
                              *(float *)(ray + k * 4 + 0x200) = fVar215;
                            }
                          }
                          auVar235 = ZEXT1664(auVar35);
                          bVar25 = (bool)(bVar25 | bVar26);
                        }
                      }
                    }
                  }
                  goto LAB_01b7ec91;
                }
                break;
              }
              lVar21 = lVar21 + -1;
            } while (lVar21 != 0);
          }
          auVar235 = ZEXT1664(auVar35);
        }
        else {
          auVar31 = vxorps_avx512vl(ZEXT416(5),auVar43);
          auVar252 = ZEXT1664(auVar31);
          auVar78._16_48_ = auVar83._16_48_;
          auVar78._0_16_ = auVar108;
        }
      }
LAB_01b7ec91:
      auVar81._32_32_ = auVar78._32_32_;
    } while (bVar11);
    auVar31 = vinsertps_avx512f(auVar95._0_16_,auVar36,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }